

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx::SubGridIntersectorKPluecker<4,_4,_true>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  vfloat<4> vVar9;
  ushort uVar10;
  ushort uVar11;
  uint uVar12;
  uint uVar13;
  BVH *bvh;
  Geometry *pGVar14;
  long lVar15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  long lVar18;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar19;
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [12];
  uint uVar31;
  undefined4 uVar32;
  int iVar33;
  long lVar34;
  uint uVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  long lVar39;
  NodeRef root;
  size_t sVar40;
  ulong uVar41;
  size_t sVar42;
  ulong uVar43;
  ulong uVar44;
  long lVar45;
  uint uVar46;
  uint uVar47;
  undefined8 *puVar48;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar49;
  ulong uVar50;
  ulong uVar51;
  NodeRef *pNVar52;
  bool bVar53;
  float fVar54;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar55;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar80;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  float fVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar105;
  undefined1 auVar104 [64];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar106;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar107;
  float fVar130;
  float fVar132;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar129;
  float fVar131;
  undefined1 auVar128 [64];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar149;
  float fVar169;
  float fVar170;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar171;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar168;
  float fVar172;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar189;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar199;
  float fVar207;
  float fVar209;
  float fVar210;
  float fVar212;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar213;
  undefined1 auVar204 [16];
  float fVar200;
  float fVar208;
  float fVar211;
  float fVar214;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar228;
  float fVar230;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar232;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar229;
  float fVar231;
  float fVar233;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar242;
  float fVar249;
  float fVar250;
  undefined1 auVar243 [16];
  float fVar251;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar256 [16];
  float fVar252;
  float fVar270;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar253;
  float fVar265;
  float fVar268;
  float fVar271;
  undefined1 auVar260 [16];
  float fVar254;
  float fVar266;
  float fVar269;
  float fVar272;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar264;
  float fVar267;
  undefined1 auVar255 [16];
  undefined1 auVar263 [64];
  float fVar279;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar278 [12];
  undefined1 auVar277 [64];
  float fVar280;
  float fVar289;
  undefined1 auVar282 [16];
  float fVar281;
  float fVar286;
  float fVar288;
  float fVar290;
  undefined1 auVar283 [16];
  float fVar285;
  float fVar287;
  undefined1 auVar284 [64];
  undefined1 auVar291 [16];
  float fVar292;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  undefined1 auVar293 [16];
  float fVar299;
  float local_1c08;
  float fStack_1c04;
  float fStack_1c00;
  float fStack_1bfc;
  Precalculations pre;
  float local_1bc8;
  float fStack_1bc4;
  float fStack_1bc0;
  vfloat<4> upper_y;
  vbool<4> terminated;
  vfloat<4> lower_y;
  undefined1 local_1b18 [16];
  vfloat<4> upper_z;
  vfloat<4> lower_z;
  float local_1a78;
  float fStack_1a74;
  float fStack_1a70;
  TravRayK<4,_true> tray;
  vfloat<4> upper_x;
  undefined8 local_1838;
  undefined8 uStack_1830;
  undefined8 local_1828;
  undefined8 uStack_1820;
  vfloat<4> lower_x;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar57 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar133 = vpcmpeqd_avx(auVar57,(undefined1  [16])valid_i->field_0);
    auVar79 = ZEXT816(0) << 0x40;
    auVar20 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar79,5);
    auVar150 = auVar133 & auVar20;
    if ((((auVar150 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar150 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar150 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar150[0xf] < '\0'
       ) {
      auVar20 = vandps_avx(auVar20,auVar133);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar95._8_4_ = 0x7fffffff;
      auVar95._0_8_ = 0x7fffffff7fffffff;
      auVar95._12_4_ = 0x7fffffff;
      auVar133 = vandps_avx(auVar95,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar234._8_4_ = 0x219392ef;
      auVar234._0_8_ = 0x219392ef219392ef;
      auVar234._12_4_ = 0x219392ef;
      auVar150 = vcmpps_avx(auVar133,auVar234,1);
      auVar255._8_4_ = 0x3f800000;
      auVar255._0_8_ = 0x3f8000003f800000;
      auVar255._12_4_ = 0x3f800000;
      auVar122 = vdivps_avx(auVar255,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar133 = vandps_avx(auVar95,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar94 = vcmpps_avx(auVar133,auVar234,1);
      auVar190 = vdivps_avx(auVar255,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar133 = vandps_avx(auVar95,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar133 = vcmpps_avx(auVar133,auVar234,1);
      auVar235._8_4_ = 0x5d5e0b6b;
      auVar235._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar235._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar122,auVar235,auVar150);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar190,auVar235,auVar94)
      ;
      auVar150 = vdivps_avx(auVar255,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar150,auVar235,auVar133);
      auVar133 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar79,1);
      auVar122._8_4_ = 0x10;
      auVar122._0_8_ = 0x1000000010;
      auVar122._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar133,auVar122);
      auVar133 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar79,5);
      auVar150._8_4_ = 0x20;
      auVar150._0_8_ = 0x2000000020;
      auVar150._12_4_ = 0x20;
      auVar190._8_4_ = 0x30;
      auVar190._0_8_ = 0x3000000030;
      auVar190._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar190,auVar150,auVar133);
      auVar133 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar79,5);
      auVar94._8_4_ = 0x40;
      auVar94._0_8_ = 0x4000000040;
      auVar94._12_4_ = 0x40;
      auVar206._8_4_ = 0x50;
      auVar206._0_8_ = 0x5000000050;
      auVar206._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar206,auVar94,auVar133);
      auVar133 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar79);
      auVar150 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar79);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar263 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar133,auVar20);
      auVar133._8_4_ = 0xff800000;
      auVar133._0_8_ = 0xff800000ff800000;
      auVar133._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar133,auVar150,auVar20);
      auVar128 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
      terminated.field_0.i[1] = auVar20._4_4_ ^ auVar57._4_4_;
      terminated.field_0.i[0] = auVar20._0_4_ ^ auVar57._0_4_;
      terminated.field_0.i[2] = auVar20._8_4_ ^ auVar57._8_4_;
      terminated.field_0.i[3] = auVar20._12_4_ ^ auVar57._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar35 = 3;
      }
      else {
        uVar35 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar52 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar49 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar277 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar284 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
LAB_0030bc18:
      do {
        do {
          root.ptr = pNVar52[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0030d446;
          pNVar52 = pNVar52 + -1;
          paVar49 = paVar49 + -1;
          vVar9.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar49->v;
          auVar104 = ZEXT1664((undefined1  [16])vVar9.field_0);
          auVar57 = vcmpps_avx((undefined1  [16])vVar9.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar31 = vmovmskps_avx(auVar57);
        } while (uVar31 == 0);
        uVar51 = (ulong)(uVar31 & 0xff);
        uVar31 = POPCOUNT(uVar31 & 0xff);
        if (uVar35 < uVar31) {
LAB_0030bc5d:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0030d446;
              auVar57 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar104._0_16_,6);
              if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar57[0xf] < '\0') {
                uVar51 = (ulong)((uint)root.ptr & 0xf);
                if (uVar51 == 8) {
                  auVar57 = vpcmpeqd_avx(auVar128._0_16_,auVar128._0_16_);
                  aVar24 = terminated.field_0;
                }
                else {
                  uVar41 = root.ptr & 0xfffffffffffffff0;
                  local_1b18 = (undefined1  [16])terminated.field_0 ^ _DAT_01f7ae20;
                  lVar36 = 0;
                  do {
                    lVar37 = lVar36 * 0x58;
                    auVar56._8_8_ = 0;
                    auVar56._0_8_ = *(ulong *)(uVar41 + 0x20 + lVar37);
                    auVar89._8_8_ = 0;
                    auVar89._0_8_ = *(ulong *)(uVar41 + 0x24 + lVar37);
                    auVar133 = vpminub_avx(auVar56,auVar89);
                    auVar57 = vpcmpeqb_avx(auVar56,auVar133);
                    auVar133 = vpcmpeqd_avx(auVar133,auVar133);
                    auVar57 = vpmovzxbd_avx(auVar57 ^ auVar133);
                    auVar57 = vpslld_avx(auVar57 ^ auVar133,0x1f);
                    iVar33 = vmovmskps_avx(auVar57);
                    if (iVar33 != 0) {
                      lVar37 = lVar37 + uVar41;
                      uVar43 = (ulong)(byte)iVar33;
                      do {
                        lVar18 = 0;
                        if (uVar43 != 0) {
                          for (; (uVar43 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
                          }
                        }
                        auVar58._8_8_ = 0;
                        auVar58._0_8_ = *(ulong *)(lVar37 + 0x20);
                        auVar57 = vpmovzxbd_avx(auVar58);
                        auVar57 = vcvtdq2ps_avx(auVar57);
                        fVar242 = *(float *)(lVar37 + 0x44);
                        fVar249 = *(float *)(lVar37 + 0x38);
                        lower_x.field_0.v[1] = fVar249 + fVar242 * auVar57._4_4_;
                        lower_x.field_0.v[0] = fVar249 + fVar242 * auVar57._0_4_;
                        lower_x.field_0.v[3] = fVar249 + fVar242 * auVar57._12_4_;
                        lower_x.field_0.v[2] = fVar249 + fVar242 * auVar57._8_4_;
                        auVar59._8_8_ = 0;
                        auVar59._0_8_ = *(ulong *)(lVar37 + 0x24);
                        auVar57 = vpmovzxbd_avx(auVar59);
                        auVar57 = vcvtdq2ps_avx(auVar57);
                        upper_x.field_0.v[1] = fVar249 + fVar242 * auVar57._4_4_;
                        upper_x.field_0.v[0] = fVar249 + fVar242 * auVar57._0_4_;
                        upper_x.field_0.v[2] = fVar249 + fVar242 * auVar57._8_4_;
                        upper_x.field_0.v[3] = fVar249 + fVar242 * auVar57._12_4_;
                        auVar60._8_8_ = 0;
                        auVar60._0_8_ = *(ulong *)(lVar37 + 0x28);
                        auVar57 = vpmovzxbd_avx(auVar60);
                        auVar57 = vcvtdq2ps_avx(auVar57);
                        fVar242 = *(float *)(lVar37 + 0x48);
                        fVar249 = *(float *)(lVar37 + 0x3c);
                        lower_y.field_0.v[1] = fVar249 + fVar242 * auVar57._4_4_;
                        lower_y.field_0.v[0] = fVar249 + fVar242 * auVar57._0_4_;
                        lower_y.field_0.v[3] = fVar249 + fVar242 * auVar57._12_4_;
                        lower_y.field_0.v[2] = fVar249 + fVar242 * auVar57._8_4_;
                        auVar61._8_8_ = 0;
                        auVar61._0_8_ = *(ulong *)(lVar37 + 0x2c);
                        auVar57 = vpmovzxbd_avx(auVar61);
                        auVar57 = vcvtdq2ps_avx(auVar57);
                        upper_y.field_0.v[1] = fVar249 + fVar242 * auVar57._4_4_;
                        upper_y.field_0.v[0] = fVar249 + fVar242 * auVar57._0_4_;
                        upper_y.field_0.v[2] = fVar249 + fVar242 * auVar57._8_4_;
                        upper_y.field_0.v[3] = fVar249 + fVar242 * auVar57._12_4_;
                        auVar62._8_8_ = 0;
                        auVar62._0_8_ = *(ulong *)(lVar37 + 0x30);
                        auVar57 = vpmovzxbd_avx(auVar62);
                        auVar57 = vcvtdq2ps_avx(auVar57);
                        fVar242 = *(float *)(lVar37 + 0x4c);
                        fVar249 = *(float *)(lVar37 + 0x40);
                        lower_z.field_0.v[1] = fVar249 + fVar242 * auVar57._4_4_;
                        lower_z.field_0.v[0] = fVar249 + fVar242 * auVar57._0_4_;
                        lower_z.field_0.v[3] = fVar249 + fVar242 * auVar57._12_4_;
                        lower_z.field_0.v[2] = fVar249 + fVar242 * auVar57._8_4_;
                        auVar63._8_8_ = 0;
                        auVar63._0_8_ = *(ulong *)(lVar37 + 0x34);
                        auVar57 = vpmovzxbd_avx(auVar63);
                        auVar57 = vcvtdq2ps_avx(auVar57);
                        upper_z.field_0.v[1] = fVar249 + fVar242 * auVar57._4_4_;
                        upper_z.field_0.v[0] = fVar249 + fVar242 * auVar57._0_4_;
                        upper_z.field_0.v[3] = fVar249 + fVar242 * auVar57._12_4_;
                        upper_z.field_0.v[2] = fVar249 + fVar242 * auVar57._8_4_;
                        iVar33 = lower_x.field_0.i[lVar18];
                        auVar64._4_4_ = iVar33;
                        auVar64._0_4_ = iVar33;
                        auVar64._8_4_ = iVar33;
                        auVar64._12_4_ = iVar33;
                        auVar25._8_8_ = tray.org.field_0._8_8_;
                        auVar25._0_8_ = tray.org.field_0._0_8_;
                        auVar26._8_8_ = tray.org.field_0._24_8_;
                        auVar26._0_8_ = tray.org.field_0._16_8_;
                        auVar27._8_8_ = tray.org.field_0._40_8_;
                        auVar27._0_8_ = tray.org.field_0._32_8_;
                        auVar57 = vsubps_avx(auVar64,auVar25);
                        auVar65._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar57._0_4_;
                        auVar65._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar57._4_4_;
                        auVar65._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar57._8_4_;
                        auVar65._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar57._12_4_;
                        iVar33 = lower_y.field_0.i[lVar18];
                        auVar173._4_4_ = iVar33;
                        auVar173._0_4_ = iVar33;
                        auVar173._8_4_ = iVar33;
                        auVar173._12_4_ = iVar33;
                        auVar57 = vsubps_avx(auVar173,auVar26);
                        auVar174._0_4_ = (float)tray.rdir.field_0._16_4_ * auVar57._0_4_;
                        auVar174._4_4_ = (float)tray.rdir.field_0._20_4_ * auVar57._4_4_;
                        auVar174._8_4_ = (float)tray.rdir.field_0._24_4_ * auVar57._8_4_;
                        auVar174._12_4_ = (float)tray.rdir.field_0._28_4_ * auVar57._12_4_;
                        iVar33 = lower_z.field_0.i[lVar18];
                        auVar201._4_4_ = iVar33;
                        auVar201._0_4_ = iVar33;
                        auVar201._8_4_ = iVar33;
                        auVar201._12_4_ = iVar33;
                        auVar57 = vsubps_avx(auVar201,auVar27);
                        auVar202._0_4_ = tray.rdir.field_0._32_4_ * auVar57._0_4_;
                        auVar202._4_4_ = tray.rdir.field_0._36_4_ * auVar57._4_4_;
                        auVar202._8_4_ = tray.rdir.field_0._40_4_ * auVar57._8_4_;
                        auVar202._12_4_ = tray.rdir.field_0._44_4_ * auVar57._12_4_;
                        iVar33 = upper_x.field_0.i[lVar18];
                        auVar236._4_4_ = iVar33;
                        auVar236._0_4_ = iVar33;
                        auVar236._8_4_ = iVar33;
                        auVar236._12_4_ = iVar33;
                        auVar57 = vsubps_avx(auVar236,auVar25);
                        auVar90._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar57._0_4_;
                        auVar90._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar57._4_4_;
                        auVar90._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar57._8_4_;
                        auVar90._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar57._12_4_;
                        iVar33 = upper_y.field_0.i[lVar18];
                        auVar152._4_4_ = iVar33;
                        auVar152._0_4_ = iVar33;
                        auVar152._8_4_ = iVar33;
                        auVar152._12_4_ = iVar33;
                        auVar57 = vsubps_avx(auVar152,auVar26);
                        auVar110._0_4_ = (float)tray.rdir.field_0._16_4_ * auVar57._0_4_;
                        auVar110._4_4_ = (float)tray.rdir.field_0._20_4_ * auVar57._4_4_;
                        auVar110._8_4_ = (float)tray.rdir.field_0._24_4_ * auVar57._8_4_;
                        auVar110._12_4_ = (float)tray.rdir.field_0._28_4_ * auVar57._12_4_;
                        auVar128 = ZEXT1664(auVar110);
                        iVar33 = upper_z.field_0.i[lVar18];
                        auVar153._4_4_ = iVar33;
                        auVar153._0_4_ = iVar33;
                        auVar153._8_4_ = iVar33;
                        auVar153._12_4_ = iVar33;
                        auVar57 = vsubps_avx(auVar153,auVar27);
                        auVar135._0_4_ = tray.rdir.field_0._32_4_ * auVar57._0_4_;
                        auVar135._4_4_ = tray.rdir.field_0._36_4_ * auVar57._4_4_;
                        auVar135._8_4_ = tray.rdir.field_0._40_4_ * auVar57._8_4_;
                        auVar135._12_4_ = tray.rdir.field_0._44_4_ * auVar57._12_4_;
                        auVar57 = vminps_avx(auVar65,auVar90);
                        auVar133 = vminps_avx(auVar174,auVar110);
                        auVar57 = vmaxps_avx(auVar57,auVar133);
                        auVar133 = vminps_avx(auVar202,auVar135);
                        auVar57 = vmaxps_avx(auVar57,auVar133);
                        auVar154._0_4_ = auVar277._0_4_ * auVar57._0_4_;
                        auVar154._4_4_ = auVar277._4_4_ * auVar57._4_4_;
                        auVar154._8_4_ = auVar277._8_4_ * auVar57._8_4_;
                        auVar154._12_4_ = auVar277._12_4_ * auVar57._12_4_;
                        auVar57 = vmaxps_avx(auVar65,auVar90);
                        auVar133 = vmaxps_avx(auVar174,auVar110);
                        auVar133 = vminps_avx(auVar57,auVar133);
                        auVar57 = vmaxps_avx(auVar202,auVar135);
                        auVar57 = vminps_avx(auVar133,auVar57);
                        auVar66._0_4_ = auVar284._0_4_ * auVar57._0_4_;
                        auVar66._4_4_ = auVar284._4_4_ * auVar57._4_4_;
                        auVar66._8_4_ = auVar284._8_4_ * auVar57._8_4_;
                        auVar66._12_4_ = auVar284._12_4_ * auVar57._12_4_;
                        auVar57 = vmaxps_avx(auVar154,(undefined1  [16])tray.tnear.field_0);
                        auVar133 = vminps_avx(auVar66,(undefined1  [16])tray.tfar.field_0);
                        auVar57 = vcmpps_avx(auVar57,auVar133,2);
                        auVar104 = ZEXT1664(local_1b18);
                        auVar57 = local_1b18 & auVar57;
                        if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                             (auVar57 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar57 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            -1 < auVar57[0xf]) {
                          bVar53 = false;
                        }
                        else {
                          uVar10 = *(ushort *)(lVar37 + lVar18 * 8);
                          uVar11 = *(ushort *)(lVar37 + 2 + lVar18 * 8);
                          uVar31 = *(uint *)(lVar37 + 0x50);
                          uVar12 = *(uint *)(lVar37 + 4 + lVar18 * 8);
                          pGVar14 = (context->scene->geometries).items[uVar31].ptr;
                          lVar15 = *(long *)&pGVar14->field_0x58;
                          lVar16 = *(long *)&pGVar14[1].time_range.upper;
                          lVar34 = (ulong)uVar12 *
                                   pGVar14[1].super_RefCount.refCounter.
                                   super___atomic_base<unsigned_long>._M_i;
                          uVar46 = uVar10 & 0x7fff;
                          uVar47 = uVar11 & 0x7fff;
                          uVar13 = *(uint *)(lVar15 + 4 + lVar34);
                          uVar44 = (ulong)uVar13;
                          uVar50 = (ulong)(uVar13 * uVar47 + *(int *)(lVar15 + lVar34) + uVar46);
                          p_Var17 = pGVar14[1].intersectionFilterN;
                          puVar48 = (undefined8 *)(lVar16 + (long)p_Var17 * uVar50);
                          puVar2 = (undefined8 *)(lVar16 + (uVar50 + 1) * (long)p_Var17);
                          lVar18 = uVar50 + uVar44;
                          lVar45 = uVar50 + uVar44 + 1;
                          puVar3 = (undefined8 *)(lVar16 + lVar18 * (long)p_Var17);
                          uStack_17a0 = puVar3[1];
                          puVar4 = (undefined8 *)(lVar16 + lVar45 * (long)p_Var17);
                          local_1768 = *puVar4;
                          uStack_1760 = puVar4[1];
                          uVar38 = (ulong)(-1 < (short)uVar10);
                          puVar4 = (undefined8 *)(lVar16 + (uVar50 + uVar38 + 1) * (long)p_Var17);
                          lVar39 = uVar38 + lVar45;
                          puVar5 = (undefined8 *)(lVar16 + lVar39 * (long)p_Var17);
                          local_1778 = *puVar5;
                          uStack_1770 = puVar5[1];
                          if ((short)uVar11 < 0) {
                            uVar44 = 0;
                          }
                          puVar5 = (undefined8 *)(lVar16 + (lVar18 + uVar44) * (long)p_Var17);
                          puVar6 = (undefined8 *)(lVar16 + (lVar45 + uVar44) * (long)p_Var17);
                          local_1738 = *puVar6;
                          uStack_1730 = puVar6[1];
                          puVar6 = (undefined8 *)(lVar16 + (uVar44 + lVar39) * (long)p_Var17);
                          lower_x.field_0._0_8_ = *puVar48;
                          lower_x.field_0._8_8_ = puVar48[1];
                          local_1798 = *puVar2;
                          uStack_1790 = puVar2[1];
                          local_1788 = *puVar4;
                          uStack_1780 = puVar4[1];
                          local_1758 = *puVar3;
                          uStack_1750 = uStack_17a0;
                          local_1748 = local_1768;
                          uStack_1740 = uStack_1760;
                          local_1728 = *puVar5;
                          uStack_1720 = puVar5[1];
                          local_1718 = local_1768;
                          uStack_1710 = uStack_1760;
                          local_1708 = local_1778;
                          uStack_1700 = uStack_1770;
                          local_16f8 = *puVar6;
                          uStack_16f0 = puVar6[1];
                          local_16e8 = local_1738;
                          uStack_16e0 = uStack_1730;
                          auVar133 = vshufps_avx(ZEXT416(uVar31),ZEXT416(uVar31),0);
                          auVar57 = vpshufd_avx(ZEXT416(uVar12),0);
                          puVar48 = &uStack_17a0;
                          uVar38 = 0;
                          do {
                            auVar190 = auVar104._0_16_;
                            uVar32 = *(undefined4 *)(puVar48 + -7);
                            auVar192._4_4_ = uVar32;
                            auVar192._0_4_ = uVar32;
                            auVar192._8_4_ = uVar32;
                            auVar192._12_4_ = uVar32;
                            uVar32 = *(undefined4 *)((long)puVar48 + -0x34);
                            auVar91._4_4_ = uVar32;
                            auVar91._0_4_ = uVar32;
                            auVar91._8_4_ = uVar32;
                            auVar91._12_4_ = uVar32;
                            uVar32 = *(undefined4 *)(puVar48 + -6);
                            auVar136._4_4_ = uVar32;
                            auVar136._0_4_ = uVar32;
                            auVar136._8_4_ = uVar32;
                            auVar136._12_4_ = uVar32;
                            uVar32 = *(undefined4 *)(puVar48 + -1);
                            auVar155._4_4_ = uVar32;
                            auVar155._0_4_ = uVar32;
                            auVar155._8_4_ = uVar32;
                            auVar155._12_4_ = uVar32;
                            uVar32 = *(undefined4 *)((long)puVar48 + -4);
                            auVar175._4_4_ = uVar32;
                            auVar175._0_4_ = uVar32;
                            auVar175._8_4_ = uVar32;
                            auVar175._12_4_ = uVar32;
                            uVar32 = *(undefined4 *)puVar48;
                            auVar203._4_4_ = uVar32;
                            auVar203._0_4_ = uVar32;
                            auVar203._8_4_ = uVar32;
                            auVar203._12_4_ = uVar32;
                            local_1828 = auVar133._0_8_;
                            uStack_1820 = auVar133._8_8_;
                            lower_z.field_0._0_8_ = local_1828;
                            lower_z.field_0._8_8_ = uStack_1820;
                            local_1838 = auVar57._0_8_;
                            uStack_1830 = auVar57._8_8_;
                            upper_z.field_0._0_8_ = local_1838;
                            upper_z.field_0._8_8_ = uStack_1830;
                            auVar150 = *(undefined1 (*) [16])(ray + 0x10);
                            auVar79 = *(undefined1 (*) [16])(ray + 0x20);
                            auVar206 = vsubps_avx(auVar91,auVar150);
                            auVar95 = vsubps_avx(auVar136,auVar79);
                            auVar234 = vsubps_avx(auVar175,auVar150);
                            auVar235 = vsubps_avx(auVar203,auVar79);
                            auVar94 = vsubps_avx(auVar234,auVar206);
                            auVar122 = vsubps_avx(auVar235,auVar95);
                            fVar209 = auVar206._0_4_;
                            fVar199 = fVar209 + auVar234._0_4_;
                            fVar212 = auVar206._4_4_;
                            fVar207 = fVar212 + auVar234._4_4_;
                            fVar215 = auVar206._8_4_;
                            fVar210 = fVar215 + auVar234._8_4_;
                            fVar217 = auVar206._12_4_;
                            fVar213 = fVar217 + auVar234._12_4_;
                            fVar266 = auVar95._0_4_;
                            fVar242 = fVar266 + auVar235._0_4_;
                            fVar269 = auVar95._4_4_;
                            fVar249 = fVar269 + auVar235._4_4_;
                            fVar272 = auVar95._8_4_;
                            fVar250 = fVar272 + auVar235._8_4_;
                            fVar279 = auVar95._12_4_;
                            fVar251 = fVar279 + auVar235._12_4_;
                            fVar280 = auVar122._0_4_;
                            auVar219._0_4_ = fVar280 * fVar199;
                            fVar285 = auVar122._4_4_;
                            auVar219._4_4_ = fVar285 * fVar207;
                            fVar287 = auVar122._8_4_;
                            auVar219._8_4_ = fVar287 * fVar210;
                            fVar289 = auVar122._12_4_;
                            auVar219._12_4_ = fVar289 * fVar213;
                            fVar54 = auVar94._0_4_;
                            auVar256._0_4_ = fVar242 * fVar54;
                            fVar55 = auVar94._4_4_;
                            auVar256._4_4_ = fVar249 * fVar55;
                            fVar21 = auVar94._8_4_;
                            auVar256._8_4_ = fVar250 * fVar21;
                            fVar107 = auVar94._12_4_;
                            auVar256._12_4_ = fVar251 * fVar107;
                            auVar255 = vsubps_avx(auVar256,auVar219);
                            auVar94 = *(undefined1 (*) [16])ray;
                            auVar22 = vsubps_avx(auVar192,auVar94);
                            auVar23 = vsubps_avx(auVar155,auVar94);
                            auVar122 = vsubps_avx(auVar23,auVar22);
                            fVar80 = auVar122._0_4_;
                            auVar244._0_4_ = fVar242 * fVar80;
                            fVar81 = auVar122._4_4_;
                            auVar244._4_4_ = fVar249 * fVar81;
                            fVar105 = auVar122._8_4_;
                            auVar244._8_4_ = fVar250 * fVar105;
                            fVar130 = auVar122._12_4_;
                            auVar244._12_4_ = fVar251 * fVar130;
                            fVar242 = auVar22._0_4_;
                            fVar252 = auVar23._0_4_ + fVar242;
                            fVar249 = auVar22._4_4_;
                            fVar264 = auVar23._4_4_ + fVar249;
                            fVar250 = auVar22._8_4_;
                            fVar267 = auVar23._8_4_ + fVar250;
                            fVar251 = auVar22._12_4_;
                            fVar270 = auVar23._12_4_ + fVar251;
                            auVar282._0_4_ = fVar252 * fVar280;
                            auVar282._4_4_ = fVar264 * fVar285;
                            auVar282._8_4_ = fVar267 * fVar287;
                            auVar282._12_4_ = fVar270 * fVar289;
                            auVar82 = vsubps_avx(auVar282,auVar244);
                            auVar245._0_4_ = fVar252 * fVar54;
                            auVar245._4_4_ = fVar264 * fVar55;
                            auVar245._8_4_ = fVar267 * fVar21;
                            auVar245._12_4_ = fVar270 * fVar107;
                            auVar204._0_4_ = fVar80 * fVar199;
                            auVar204._4_4_ = fVar81 * fVar207;
                            auVar204._8_4_ = fVar105 * fVar210;
                            auVar204._12_4_ = fVar130 * fVar213;
                            auVar83 = vsubps_avx(auVar204,auVar245);
                            auVar278 = *(undefined1 (*) [12])(ray + 0x60);
                            fVar253 = *(float *)(ray + 0x6c);
                            auVar122 = *(undefined1 (*) [16])(ray + 0x50);
                            fVar199 = auVar122._0_4_;
                            fVar210 = auVar122._4_4_;
                            fVar252 = auVar122._8_4_;
                            fVar267 = auVar122._12_4_;
                            fVar265 = *(float *)(ray + 0x40);
                            fVar268 = *(float *)(ray + 0x44);
                            fVar271 = *(float *)(ray + 0x48);
                            auVar30 = *(undefined1 (*) [12])(ray + 0x40);
                            fVar172 = *(float *)(ray + 0x4c);
                            auVar291._0_4_ =
                                 auVar255._0_4_ * fVar265 +
                                 auVar82._0_4_ * fVar199 + auVar83._0_4_ * *(float *)(ray + 0x60);
                            auVar291._4_4_ =
                                 auVar255._4_4_ * fVar268 +
                                 auVar82._4_4_ * fVar210 + auVar83._4_4_ * *(float *)(ray + 100);
                            auVar291._8_4_ =
                                 auVar255._8_4_ * fVar271 +
                                 auVar82._8_4_ * fVar252 + auVar83._8_4_ * *(float *)(ray + 0x68);
                            auVar291._12_4_ =
                                 auVar255._12_4_ * fVar172 +
                                 auVar82._12_4_ * fVar267 + auVar83._12_4_ * fVar253;
                            uVar32 = *(undefined4 *)((long)puVar48 + -0x24);
                            auVar156._4_4_ = uVar32;
                            auVar156._0_4_ = uVar32;
                            auVar156._8_4_ = uVar32;
                            auVar156._12_4_ = uVar32;
                            auVar150 = vsubps_avx(auVar156,auVar150);
                            uVar32 = *(undefined4 *)(puVar48 + -4);
                            auVar111._4_4_ = uVar32;
                            auVar111._0_4_ = uVar32;
                            auVar111._8_4_ = uVar32;
                            auVar111._12_4_ = uVar32;
                            auVar79 = vsubps_avx(auVar111,auVar79);
                            auVar122 = vsubps_avx(auVar206,auVar150);
                            auVar206 = vsubps_avx(auVar95,auVar79);
                            fVar281 = fVar209 + auVar150._0_4_;
                            fVar286 = fVar212 + auVar150._4_4_;
                            fVar288 = fVar215 + auVar150._8_4_;
                            fVar290 = fVar217 + auVar150._12_4_;
                            fVar200 = fVar266 + auVar79._0_4_;
                            fVar208 = fVar269 + auVar79._4_4_;
                            fVar211 = fVar272 + auVar79._8_4_;
                            fVar214 = fVar279 + auVar79._12_4_;
                            fVar207 = auVar206._0_4_;
                            auVar237._0_4_ = fVar281 * fVar207;
                            fVar213 = auVar206._4_4_;
                            auVar237._4_4_ = fVar286 * fVar213;
                            fVar264 = auVar206._8_4_;
                            auVar237._8_4_ = fVar288 * fVar264;
                            fVar270 = auVar206._12_4_;
                            auVar237._12_4_ = fVar290 * fVar270;
                            fVar106 = auVar122._0_4_;
                            auVar246._0_4_ = fVar106 * fVar200;
                            fVar129 = auVar122._4_4_;
                            auVar246._4_4_ = fVar129 * fVar208;
                            fVar131 = auVar122._8_4_;
                            auVar246._8_4_ = fVar131 * fVar211;
                            fVar132 = auVar122._12_4_;
                            auVar246._12_4_ = fVar132 * fVar214;
                            auVar122 = vsubps_avx(auVar246,auVar237);
                            uVar32 = *(undefined4 *)(puVar48 + -5);
                            auVar247._4_4_ = uVar32;
                            auVar247._0_4_ = uVar32;
                            auVar247._8_4_ = uVar32;
                            auVar247._12_4_ = uVar32;
                            auVar94 = vsubps_avx(auVar247,auVar94);
                            auVar206 = vsubps_avx(auVar22,auVar94);
                            fVar292 = auVar206._0_4_;
                            auVar205._0_4_ = fVar292 * fVar200;
                            fVar294 = auVar206._4_4_;
                            auVar205._4_4_ = fVar294 * fVar208;
                            fVar295 = auVar206._8_4_;
                            auVar205._8_4_ = fVar295 * fVar211;
                            fVar296 = auVar206._12_4_;
                            auVar205._12_4_ = fVar296 * fVar214;
                            fVar200 = auVar94._0_4_ + fVar242;
                            fVar208 = auVar94._4_4_ + fVar249;
                            fVar211 = auVar94._8_4_ + fVar250;
                            fVar214 = auVar94._12_4_ + fVar251;
                            auVar257._0_4_ = fVar200 * fVar207;
                            auVar257._4_4_ = fVar208 * fVar213;
                            auVar257._8_4_ = fVar211 * fVar264;
                            auVar257._12_4_ = fVar214 * fVar270;
                            auVar206 = vsubps_avx(auVar257,auVar205);
                            auVar258._0_4_ = fVar200 * fVar106;
                            auVar258._4_4_ = fVar208 * fVar129;
                            auVar258._8_4_ = fVar211 * fVar131;
                            auVar258._12_4_ = fVar214 * fVar132;
                            auVar67._0_4_ = fVar292 * fVar281;
                            auVar67._4_4_ = fVar294 * fVar286;
                            auVar67._8_4_ = fVar295 * fVar288;
                            auVar67._12_4_ = fVar296 * fVar290;
                            auVar95 = vsubps_avx(auVar67,auVar258);
                            auVar112._8_4_ = 0x7fffffff;
                            auVar112._0_8_ = 0x7fffffff7fffffff;
                            auVar112._12_4_ = 0x7fffffff;
                            local_1c08 = auVar278._0_4_;
                            fStack_1c04 = auVar278._4_4_;
                            fStack_1c00 = auVar278._8_4_;
                            auVar283._0_4_ =
                                 auVar122._0_4_ * fVar265 +
                                 local_1c08 * auVar95._0_4_ + fVar199 * auVar206._0_4_;
                            auVar283._4_4_ =
                                 auVar122._4_4_ * fVar268 +
                                 fStack_1c04 * auVar95._4_4_ + fVar210 * auVar206._4_4_;
                            auVar283._8_4_ =
                                 auVar122._8_4_ * fVar271 +
                                 fStack_1c00 * auVar95._8_4_ + fVar252 * auVar206._8_4_;
                            auVar283._12_4_ =
                                 auVar122._12_4_ * fVar172 +
                                 fVar253 * auVar95._12_4_ + fVar267 * auVar206._12_4_;
                            auVar122 = vsubps_avx(auVar94,auVar23);
                            fVar216 = auVar94._0_4_ + auVar23._0_4_;
                            fVar228 = auVar94._4_4_ + auVar23._4_4_;
                            fVar230 = auVar94._8_4_ + auVar23._8_4_;
                            fVar232 = auVar94._12_4_ + auVar23._12_4_;
                            auVar94 = vsubps_avx(auVar150,auVar234);
                            fVar149 = auVar150._0_4_ + auVar234._0_4_;
                            fVar169 = auVar150._4_4_ + auVar234._4_4_;
                            fVar170 = auVar150._8_4_ + auVar234._8_4_;
                            fVar171 = auVar150._12_4_ + auVar234._12_4_;
                            auVar150 = vsubps_avx(auVar79,auVar235);
                            fVar281 = auVar79._0_4_ + auVar235._0_4_;
                            fVar286 = auVar79._4_4_ + auVar235._4_4_;
                            fVar288 = auVar79._8_4_ + auVar235._8_4_;
                            fVar290 = auVar79._12_4_ + auVar235._12_4_;
                            fVar229 = auVar150._0_4_;
                            auVar176._0_4_ = fVar229 * fVar149;
                            fVar231 = auVar150._4_4_;
                            auVar176._4_4_ = fVar231 * fVar169;
                            fVar233 = auVar150._8_4_;
                            auVar176._8_4_ = fVar233 * fVar170;
                            fVar254 = auVar150._12_4_;
                            auVar176._12_4_ = fVar254 * fVar171;
                            fVar200 = auVar94._0_4_;
                            auVar238._0_4_ = fVar200 * fVar281;
                            fVar208 = auVar94._4_4_;
                            auVar238._4_4_ = fVar208 * fVar286;
                            fVar211 = auVar94._8_4_;
                            auVar238._8_4_ = fVar211 * fVar288;
                            fVar214 = auVar94._12_4_;
                            auVar238._12_4_ = fVar214 * fVar290;
                            auVar150 = vsubps_avx(auVar238,auVar176);
                            fVar189 = auVar122._0_4_;
                            auVar137._0_4_ = fVar189 * fVar281;
                            fVar281 = auVar122._4_4_;
                            auVar137._4_4_ = fVar281 * fVar286;
                            fVar286 = auVar122._8_4_;
                            auVar137._8_4_ = fVar286 * fVar288;
                            fVar288 = auVar122._12_4_;
                            auVar137._12_4_ = fVar288 * fVar290;
                            auVar239._0_4_ = fVar216 * fVar229;
                            auVar239._4_4_ = fVar228 * fVar231;
                            auVar239._8_4_ = fVar230 * fVar233;
                            auVar239._12_4_ = fVar232 * fVar254;
                            auVar79 = vsubps_avx(auVar239,auVar137);
                            auVar220._0_4_ = fVar216 * fVar200;
                            auVar220._4_4_ = fVar228 * fVar208;
                            auVar220._8_4_ = fVar230 * fVar211;
                            auVar220._12_4_ = fVar232 * fVar214;
                            auVar157._0_4_ = fVar189 * fVar149;
                            auVar157._4_4_ = fVar281 * fVar169;
                            auVar157._8_4_ = fVar286 * fVar170;
                            auVar157._12_4_ = fVar288 * fVar171;
                            auVar94 = vsubps_avx(auVar157,auVar220);
                            auVar138._0_4_ =
                                 fVar265 * auVar150._0_4_ +
                                 local_1c08 * auVar94._0_4_ + fVar199 * auVar79._0_4_;
                            auVar138._4_4_ =
                                 fVar268 * auVar150._4_4_ +
                                 fStack_1c04 * auVar94._4_4_ + fVar210 * auVar79._4_4_;
                            auVar138._8_4_ =
                                 fVar271 * auVar150._8_4_ +
                                 fStack_1c00 * auVar94._8_4_ + fVar252 * auVar79._8_4_;
                            auVar138._12_4_ =
                                 fVar172 * auVar150._12_4_ +
                                 fVar253 * auVar94._12_4_ + fVar267 * auVar79._12_4_;
                            auVar273._0_4_ = auVar138._0_4_ + auVar291._0_4_ + auVar283._0_4_;
                            auVar273._4_4_ = auVar138._4_4_ + auVar291._4_4_ + auVar283._4_4_;
                            auVar273._8_4_ = auVar138._8_4_ + auVar291._8_4_ + auVar283._8_4_;
                            auVar273._12_4_ = auVar138._12_4_ + auVar291._12_4_ + auVar283._12_4_;
                            auVar150 = vminps_avx(auVar291,auVar283);
                            auVar79 = vminps_avx(auVar150,auVar138);
                            auVar150 = vandps_avx(auVar273,auVar112);
                            auVar177._0_4_ = auVar150._0_4_ * 1.1920929e-07;
                            auVar177._4_4_ = auVar150._4_4_ * 1.1920929e-07;
                            auVar177._8_4_ = auVar150._8_4_ * 1.1920929e-07;
                            auVar177._12_4_ = auVar150._12_4_ * 1.1920929e-07;
                            uVar44 = CONCAT44(auVar177._4_4_,auVar177._0_4_);
                            auVar221._0_8_ = uVar44 ^ 0x8000000080000000;
                            auVar221._8_4_ = -auVar177._8_4_;
                            auVar221._12_4_ = -auVar177._12_4_;
                            auVar79 = vcmpps_avx(auVar79,auVar221,5);
                            auVar94 = vmaxps_avx(auVar291,auVar283);
                            auVar94 = vmaxps_avx(auVar94,auVar138);
                            auVar94 = vcmpps_avx(auVar94,auVar177,2);
                            auVar79 = vorps_avx(auVar79,auVar94);
                            auVar94 = auVar190 & auVar79;
                            uVar32 = *(undefined4 *)(puVar48 + -3);
                            uVar7 = *(undefined4 *)((long)puVar48 + -0x14);
                            uVar8 = *(undefined4 *)(puVar48 + -2);
                            auVar158._4_4_ = uVar8;
                            auVar158._0_4_ = uVar8;
                            auVar158._8_4_ = uVar8;
                            auVar158._12_4_ = uVar8;
                            if ((((auVar94 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 && (auVar94 >> 0x3f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                (auVar94 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                                && -1 < auVar94[0xf]) {
LAB_0030cc35:
                              auVar128 = ZEXT1664(auVar112);
                              auVar263 = ZEXT1664(CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                 );
                              auVar248 = auVar190;
                            }
                            else {
                              auVar159._0_4_ = fVar106 * fVar280;
                              auVar159._4_4_ = fVar129 * fVar285;
                              auVar159._8_4_ = fVar131 * fVar287;
                              auVar159._12_4_ = fVar132 * fVar289;
                              auVar178._0_4_ = fVar54 * fVar207;
                              auVar178._4_4_ = fVar55 * fVar213;
                              auVar178._8_4_ = fVar21 * fVar264;
                              auVar178._12_4_ = fVar107 * fVar270;
                              auVar206 = vsubps_avx(auVar178,auVar159);
                              auVar222._0_4_ = fVar200 * fVar207;
                              auVar222._4_4_ = fVar208 * fVar213;
                              auVar222._8_4_ = fVar211 * fVar264;
                              auVar222._12_4_ = fVar214 * fVar270;
                              auVar240._0_4_ = fVar106 * fVar229;
                              auVar240._4_4_ = fVar129 * fVar231;
                              auVar240._8_4_ = fVar131 * fVar233;
                              auVar240._12_4_ = fVar132 * fVar254;
                              auVar95 = vsubps_avx(auVar240,auVar222);
                              auVar94 = vandps_avx(auVar159,auVar112);
                              auVar122 = vandps_avx(auVar222,auVar112);
                              auVar94 = vcmpps_avx(auVar94,auVar122,1);
                              aVar19 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                       vblendvps_avx(auVar95,auVar206,auVar94);
                              auVar92._0_4_ = fVar292 * fVar229;
                              auVar92._4_4_ = fVar294 * fVar231;
                              auVar92._8_4_ = fVar295 * fVar233;
                              auVar92._12_4_ = fVar296 * fVar254;
                              auVar160._0_4_ = fVar292 * fVar280;
                              auVar160._4_4_ = fVar294 * fVar285;
                              auVar160._8_4_ = fVar295 * fVar287;
                              auVar160._12_4_ = fVar296 * fVar289;
                              auVar179._0_4_ = fVar80 * fVar207;
                              auVar179._4_4_ = fVar81 * fVar213;
                              auVar179._8_4_ = fVar105 * fVar264;
                              auVar179._12_4_ = fVar130 * fVar270;
                              auVar206 = vsubps_avx(auVar160,auVar179);
                              auVar113._0_4_ = fVar189 * fVar207;
                              auVar113._4_4_ = fVar281 * fVar213;
                              auVar113._8_4_ = fVar286 * fVar264;
                              auVar113._12_4_ = fVar288 * fVar270;
                              auVar95 = vsubps_avx(auVar113,auVar92);
                              auVar94 = vandps_avx(auVar179,auVar112);
                              auVar122 = vandps_avx(auVar92,auVar112);
                              auVar94 = vcmpps_avx(auVar94,auVar122,1);
                              auVar206 = vblendvps_avx(auVar95,auVar206,auVar94);
                              auVar93._0_4_ = fVar106 * fVar189;
                              auVar93._4_4_ = fVar129 * fVar281;
                              auVar93._8_4_ = fVar131 * fVar286;
                              auVar93._12_4_ = fVar132 * fVar288;
                              auVar114._0_4_ = fVar80 * fVar106;
                              auVar114._4_4_ = fVar81 * fVar129;
                              auVar114._8_4_ = fVar105 * fVar131;
                              auVar114._12_4_ = fVar130 * fVar132;
                              auVar161._0_4_ = fVar292 * fVar54;
                              auVar161._4_4_ = fVar294 * fVar55;
                              auVar161._8_4_ = fVar295 * fVar21;
                              auVar161._12_4_ = fVar296 * fVar107;
                              auVar68._0_4_ = fVar292 * fVar200;
                              auVar68._4_4_ = fVar294 * fVar208;
                              auVar68._8_4_ = fVar295 * fVar211;
                              auVar68._12_4_ = fVar296 * fVar214;
                              auVar95 = vsubps_avx(auVar114,auVar161);
                              auVar234 = vsubps_avx(auVar68,auVar93);
                              auVar94 = vandps_avx(auVar161,auVar112);
                              auVar122 = vandps_avx(auVar93,auVar112);
                              auVar94 = vcmpps_avx(auVar94,auVar122,1);
                              auVar94 = vblendvps_avx(auVar234,auVar95,auVar94);
                              local_1a78 = auVar30._0_4_;
                              fStack_1a74 = auVar30._4_4_;
                              fStack_1a70 = auVar30._8_4_;
                              fVar54 = aVar19.v[0] * local_1a78 +
                                       auVar94._0_4_ * local_1c08 + auVar206._0_4_ * fVar199;
                              fVar80 = aVar19.v[1] * fStack_1a74 +
                                       auVar94._4_4_ * fStack_1c04 + auVar206._4_4_ * fVar210;
                              fVar199 = aVar19.v[2] * fStack_1a70 +
                                        auVar94._8_4_ * fStack_1c00 + auVar206._8_4_ * fVar252;
                              fVar207 = aVar19.v[3] * fVar172 +
                                        auVar94._12_4_ * fVar253 + auVar206._12_4_ * fVar267;
                              auVar69._0_4_ = fVar54 + fVar54;
                              auVar69._4_4_ = fVar80 + fVar80;
                              auVar69._8_4_ = fVar199 + fVar199;
                              auVar69._12_4_ = fVar207 + fVar207;
                              fVar54 = aVar19.v[0] * fVar242 +
                                       auVar94._0_4_ * fVar266 + auVar206._0_4_ * fVar209;
                              fVar80 = aVar19.v[1] * fVar249 +
                                       auVar94._4_4_ * fVar269 + auVar206._4_4_ * fVar212;
                              fVar199 = aVar19.v[2] * fVar250 +
                                        auVar94._8_4_ * fVar272 + auVar206._8_4_ * fVar215;
                              fVar207 = aVar19.v[3] * fVar251 +
                                        auVar94._12_4_ * fVar279 + auVar206._12_4_ * fVar217;
                              auVar94 = vrcpps_avx(auVar69);
                              fVar242 = auVar94._0_4_;
                              auVar162._0_4_ = auVar69._0_4_ * fVar242;
                              fVar249 = auVar94._4_4_;
                              auVar162._4_4_ = auVar69._4_4_ * fVar249;
                              fVar250 = auVar94._8_4_;
                              auVar162._8_4_ = auVar69._8_4_ * fVar250;
                              fVar251 = auVar94._12_4_;
                              auVar162._12_4_ = auVar69._12_4_ * fVar251;
                              auVar180._8_4_ = 0x3f800000;
                              auVar180._0_8_ = 0x3f8000003f800000;
                              auVar180._12_4_ = 0x3f800000;
                              auVar94 = vsubps_avx(auVar180,auVar162);
                              auVar181._0_4_ =
                                   (fVar54 + fVar54) * (fVar242 + fVar242 * auVar94._0_4_);
                              auVar181._4_4_ =
                                   (fVar80 + fVar80) * (fVar249 + fVar249 * auVar94._4_4_);
                              auVar181._8_4_ =
                                   (fVar199 + fVar199) * (fVar250 + fVar250 * auVar94._8_4_);
                              auVar181._12_4_ =
                                   (fVar207 + fVar207) * (fVar251 + fVar251 * auVar94._12_4_);
                              auVar112 = vcmpps_avx(auVar181,*(undefined1 (*) [16])(ray + 0x80),2);
                              auVar94 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar181,2);
                              auVar94 = vandps_avx(auVar94,auVar112);
                              auVar206 = SUB6416(ZEXT864(0),0);
                              auVar122 = vcmpps_avx(auVar69,ZEXT816(0) << 0x40,4);
                              auVar94 = vandps_avx(auVar122,auVar94);
                              auVar122 = vandps_avx(auVar79,auVar190);
                              auVar94 = vpslld_avx(auVar94,0x1f);
                              auVar95 = vpsrad_avx(auVar94,0x1f);
                              auVar94 = auVar122 & auVar95;
                              if ((((auVar94 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0 &&
                                   (auVar94 >> 0x3f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar94 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && -1 < auVar94[0xf]) goto LAB_0030cc35;
                              pGVar14 = (context->scene->geometries).items
                                        [(uint)lower_z.field_0.i[uVar38]].ptr;
                              uVar31 = pGVar14->mask;
                              auVar115._4_4_ = uVar31;
                              auVar115._0_4_ = uVar31;
                              auVar115._8_4_ = uVar31;
                              auVar115._12_4_ = uVar31;
                              auVar94 = vandps_avx(auVar115,*(undefined1 (*) [16])(ray + 0x90));
                              auVar128 = ZEXT1664(auVar94);
                              auVar122 = vandps_avx(auVar95,auVar122);
                              auVar94 = vpcmpeqd_avx(auVar94,ZEXT816(0) << 0x40);
                              auVar95 = auVar122 & ~auVar94;
                              auVar263 = ZEXT1664(CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                 );
                              if ((((auVar95 >> 0x1f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0 ||
                                   (auVar95 >> 0x3f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar95 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || auVar95[0xf] < '\0') {
                                aVar168 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                          vandnps_avx(auVar94,auVar122);
                                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                   (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                  auVar75._0_4_ = (float)(int)(*(ushort *)(lVar15 + 8 + lVar34) - 1)
                                  ;
                                  auVar278 = auVar104._4_12_;
                                  auVar75._4_12_ = auVar278;
                                  auVar94 = vrcpss_avx(auVar75,auVar75);
                                  auVar99._0_4_ =
                                       (float)(int)(*(ushort *)(lVar15 + 10 + lVar34) - 1);
                                  auVar99._4_12_ = auVar278;
                                  auVar118._0_4_ = (float)(((uint)uVar38 & 1) + uVar46);
                                  auVar118._4_12_ = auVar278;
                                  auVar95 = vshufps_avx(auVar118,auVar118,0);
                                  auVar94 = ZEXT416((uint)(auVar94._0_4_ *
                                                          (2.0 - auVar94._0_4_ * auVar75._0_4_)));
                                  auVar94 = vshufps_avx(auVar94,auVar94,0);
                                  auVar76._0_4_ =
                                       (auVar291._0_4_ + auVar95._0_4_ * auVar273._0_4_) *
                                       auVar94._0_4_;
                                  auVar76._4_4_ =
                                       (auVar291._4_4_ + auVar95._4_4_ * auVar273._4_4_) *
                                       auVar94._4_4_;
                                  auVar76._8_4_ =
                                       (auVar291._8_4_ + auVar95._8_4_ * auVar273._8_4_) *
                                       auVar94._8_4_;
                                  auVar76._12_4_ =
                                       (auVar291._12_4_ + auVar95._12_4_ * auVar273._12_4_) *
                                       auVar94._12_4_;
                                  auVar95 = vrcpss_avx(auVar99,auVar99);
                                  auVar94 = vblendvps_avx(auVar291,auVar76,auVar122);
                                  auVar141._0_4_ =
                                       (float)(int)(((uint)(uVar38 >> 1) & 0x7fffffff) + uVar47);
                                  auVar141._4_12_ = auVar79._4_12_;
                                  auVar79 = vshufps_avx(auVar141,auVar141,0);
                                  auVar95 = ZEXT416((uint)(auVar95._0_4_ *
                                                          (2.0 - auVar95._0_4_ * auVar99._0_4_)));
                                  auVar95 = vshufps_avx(auVar95,auVar95,0);
                                  auVar100._0_4_ =
                                       (auVar283._0_4_ + auVar79._0_4_ * auVar273._0_4_) *
                                       auVar95._0_4_;
                                  auVar100._4_4_ =
                                       (auVar283._4_4_ + auVar79._4_4_ * auVar273._4_4_) *
                                       auVar95._4_4_;
                                  auVar100._8_4_ =
                                       (auVar283._8_4_ + auVar79._8_4_ * auVar273._8_4_) *
                                       auVar95._8_4_;
                                  auVar100._12_4_ =
                                       (auVar283._12_4_ + auVar79._12_4_ * auVar273._12_4_) *
                                       auVar95._12_4_;
                                  auVar95 = vblendvps_avx(auVar283,auVar100,auVar122);
                                  auVar79 = vrcpps_avx(auVar273);
                                  fVar242 = auVar79._0_4_;
                                  auVar142._0_4_ = auVar273._0_4_ * fVar242;
                                  fVar249 = auVar79._4_4_;
                                  auVar142._4_4_ = auVar273._4_4_ * fVar249;
                                  fVar250 = auVar79._8_4_;
                                  auVar142._8_4_ = auVar273._8_4_ * fVar250;
                                  fVar251 = auVar79._12_4_;
                                  auVar142._12_4_ = auVar273._12_4_ * fVar251;
                                  auVar197._8_4_ = 0x3f800000;
                                  auVar197._0_8_ = 0x3f8000003f800000;
                                  auVar197._12_4_ = 0x3f800000;
                                  auVar79 = vsubps_avx(auVar197,auVar142);
                                  auVar119._0_4_ = fVar242 + fVar242 * auVar79._0_4_;
                                  auVar119._4_4_ = fVar249 + fVar249 * auVar79._4_4_;
                                  auVar119._8_4_ = fVar250 + fVar250 * auVar79._8_4_;
                                  auVar119._12_4_ = fVar251 + fVar251 * auVar79._12_4_;
                                  auVar143._8_4_ = 0x219392ef;
                                  auVar143._0_8_ = 0x219392ef219392ef;
                                  auVar143._12_4_ = 0x219392ef;
                                  auVar150 = vcmpps_avx(auVar150,auVar143,5);
                                  auVar79 = vandps_avx(auVar150,auVar119);
                                  auVar128 = ZEXT1664(auVar79);
                                  auVar77._0_4_ = auVar94._0_4_ * auVar79._0_4_;
                                  auVar77._4_4_ = auVar94._4_4_ * auVar79._4_4_;
                                  auVar77._8_4_ = auVar94._8_4_ * auVar79._8_4_;
                                  auVar77._12_4_ = auVar94._12_4_ * auVar79._12_4_;
                                  auVar101._0_4_ = auVar95._0_4_ * auVar79._0_4_;
                                  auVar101._4_4_ = auVar95._4_4_ * auVar79._4_4_;
                                  auVar101._8_4_ = auVar95._8_4_ * auVar79._8_4_;
                                  auVar101._12_4_ = auVar95._12_4_ * auVar79._12_4_;
                                  upper_x.field_0 = aVar19;
                                  vminps_avx(auVar77,auVar197);
                                  vminps_avx(auVar101,auVar197);
                                  vpshufd_avx(ZEXT416((uint)upper_z.field_0.i[uVar38]),0);
                                  auVar150 = vpshufd_avx(ZEXT416((uint)lower_z.field_0.i[uVar38]),0)
                                  ;
                                  vcmpps_avx(ZEXT1632(auVar150),ZEXT1632(auVar150),0xf);
                                  auVar150 = *(undefined1 (*) [16])(ray + 0x80);
                                  auVar94 = vblendvps_avx(auVar150,auVar181,
                                                          (undefined1  [16])aVar168);
                                  *(undefined1 (*) [16])(ray + 0x80) = auVar94;
                                  upper_y.field_0 = aVar168;
                                  lower_y.field_0._0_8_ = &upper_y;
                                  lower_y.field_0._8_8_ = pGVar14->userPtr;
                                  if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                    auVar128 = ZEXT1664(auVar79);
                                    auVar263._0_8_ =
                                         (*pGVar14->occlusionFilterN)
                                                   ((RTCFilterFunctionNArguments *)&lower_y);
                                    auVar263._8_56_ = extraout_var;
                                    auVar94 = auVar263._0_16_;
                                    auVar206 = ZEXT816(0);
                                    auVar263 = ZEXT1664(CONCAT412(0x7f800000,
                                                                  CONCAT48(0x7f800000,
                                                                           0x7f8000007f800000)));
                                  }
                                  auVar206 = auVar206 << 0x40;
                                  if (upper_y.field_0 ==
                                      (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0) {
                                    auVar79 = vpcmpeqd_avx((undefined1  [16])0x0,auVar206);
                                    auVar79 = auVar79 ^ _DAT_01f7ae20;
                                  }
                                  else {
                                    p_Var17 = context->args->filter;
                                    if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                                       (((context->args->flags &
                                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                        (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                                      auVar128._0_8_ =
                                           (*p_Var17)((RTCFilterFunctionNArguments *)&lower_y);
                                      auVar128._8_56_ = extraout_var_00;
                                      auVar94 = auVar128._0_16_;
                                      auVar206 = ZEXT816(0) << 0x40;
                                      auVar263 = ZEXT1664(CONCAT412(0x7f800000,
                                                                    CONCAT48(0x7f800000,
                                                                             0x7f8000007f800000)));
                                    }
                                    auVar206 = vpcmpeqd_avx((undefined1  [16])upper_y.field_0,
                                                            auVar206);
                                    auVar79 = vpcmpeqd_avx(auVar94,auVar94);
                                    auVar79 = auVar206 ^ auVar79;
                                    auVar125._8_4_ = 0xff800000;
                                    auVar125._0_8_ = 0xff800000ff800000;
                                    auVar125._12_4_ = 0xff800000;
                                    auVar128 = ZEXT1664(auVar125);
                                    auVar94 = vblendvps_avx(auVar125,*(undefined1 (*) [16])
                                                                      (ray + 0x80),auVar206);
                                    *(undefined1 (*) [16])(ray + 0x80) = auVar94;
                                  }
                                  auVar79 = vpslld_avx(auVar79,0x1f);
                                  aVar168 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                            vpsrad_avx(auVar79,0x1f);
                                  auVar150 = vblendvps_avx(auVar150,*(undefined1 (*) [16])pRVar1,
                                                           auVar79);
                                  *(undefined1 (*) [16])pRVar1 = auVar150;
                                }
                                auVar190 = vpandn_avx((undefined1  [16])aVar168,auVar190);
                              }
                              auVar248._0_4_ = auVar122._0_4_ ^ auVar104._0_4_;
                              auVar248._4_4_ = auVar122._4_4_ ^ auVar104._4_4_;
                              auVar248._8_4_ = auVar122._8_4_ ^ auVar104._8_4_;
                              auVar248._12_4_ = auVar122._12_4_ ^ auVar104._12_4_;
                            }
                            if ((((auVar248 >> 0x1f & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0 &&
                                 (auVar248 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 ) && (auVar248 >> 0x5f & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) && -1 < auVar248[0xf]) {
                              auVar104 = ZEXT1664(auVar190);
                            }
                            else {
                              auVar150 = *(undefined1 (*) [16])ray;
                              auVar79 = *(undefined1 (*) [16])(ray + 0x10);
                              auVar94 = *(undefined1 (*) [16])(ray + 0x20);
                              auVar29._4_4_ = uVar32;
                              auVar29._0_4_ = uVar32;
                              auVar29._8_4_ = uVar32;
                              auVar29._12_4_ = uVar32;
                              auVar122 = vsubps_avx(auVar29,auVar150);
                              auVar28._4_4_ = uVar7;
                              auVar28._0_4_ = uVar7;
                              auVar28._8_4_ = uVar7;
                              auVar28._12_4_ = uVar7;
                              auVar206 = vsubps_avx(auVar28,auVar79);
                              auVar95 = vsubps_avx(auVar158,auVar94);
                              auVar234 = vsubps_avx(auVar155,auVar150);
                              auVar235 = vsubps_avx(auVar175,auVar79);
                              auVar255 = vsubps_avx(auVar203,auVar94);
                              auVar22 = vsubps_avx(auVar247,auVar150);
                              auVar79 = vsubps_avx(auVar156,auVar79);
                              auVar94 = vsubps_avx(auVar111,auVar94);
                              auVar150 = vsubps_avx(auVar22,auVar122);
                              auVar23 = vsubps_avx(auVar79,auVar206);
                              auVar82 = vsubps_avx(auVar94,auVar95);
                              fVar242 = auVar206._0_4_;
                              fVar107 = auVar79._0_4_ + fVar242;
                              fVar250 = auVar206._4_4_;
                              fVar130 = auVar79._4_4_ + fVar250;
                              fVar54 = auVar206._8_4_;
                              fVar267 = auVar79._8_4_ + fVar54;
                              fVar199 = auVar206._12_4_;
                              fVar270 = auVar79._12_4_ + fVar199;
                              fVar289 = auVar95._0_4_;
                              fVar81 = fVar289 + auVar94._0_4_;
                              fVar294 = auVar95._4_4_;
                              fVar213 = fVar294 + auVar94._4_4_;
                              fVar296 = auVar95._8_4_;
                              fVar105 = fVar296 + auVar94._8_4_;
                              fVar298 = auVar95._12_4_;
                              fVar264 = fVar298 + auVar94._12_4_;
                              fVar55 = auVar82._0_4_;
                              auVar259._0_4_ = fVar107 * fVar55;
                              fVar210 = auVar82._4_4_;
                              auVar259._4_4_ = fVar130 * fVar210;
                              fVar21 = auVar82._8_4_;
                              auVar259._8_4_ = fVar267 * fVar21;
                              fVar252 = auVar82._12_4_;
                              auVar259._12_4_ = fVar270 * fVar252;
                              fVar189 = auVar23._0_4_;
                              auVar274._0_4_ = fVar189 * fVar81;
                              fVar216 = auVar23._4_4_;
                              auVar274._4_4_ = fVar216 * fVar213;
                              fVar228 = auVar23._8_4_;
                              auVar274._8_4_ = fVar228 * fVar105;
                              fVar230 = auVar23._12_4_;
                              auVar274._12_4_ = fVar230 * fVar264;
                              auVar23 = vsubps_avx(auVar274,auVar259);
                              fVar249 = auVar122._0_4_;
                              fVar253 = auVar22._0_4_ + fVar249;
                              fVar251 = auVar122._4_4_;
                              fVar265 = auVar22._4_4_ + fVar251;
                              fVar80 = auVar122._8_4_;
                              fVar268 = auVar22._8_4_ + fVar80;
                              fVar207 = auVar122._12_4_;
                              fVar271 = auVar22._12_4_ + fVar207;
                              fVar217 = auVar150._0_4_;
                              auVar96._0_4_ = fVar217 * fVar81;
                              fVar229 = auVar150._4_4_;
                              auVar96._4_4_ = fVar229 * fVar213;
                              fVar231 = auVar150._8_4_;
                              auVar96._8_4_ = fVar231 * fVar105;
                              fVar233 = auVar150._12_4_;
                              auVar96._12_4_ = fVar233 * fVar264;
                              auVar275._0_4_ = fVar253 * fVar55;
                              auVar275._4_4_ = fVar265 * fVar210;
                              auVar275._8_4_ = fVar268 * fVar21;
                              auVar275._12_4_ = fVar271 * fVar252;
                              auVar82 = vsubps_avx(auVar275,auVar96);
                              auVar260._0_4_ = fVar253 * fVar189;
                              auVar260._4_4_ = fVar265 * fVar216;
                              auVar260._8_4_ = fVar268 * fVar228;
                              auVar260._12_4_ = fVar271 * fVar230;
                              auVar70._0_4_ = fVar217 * fVar107;
                              auVar70._4_4_ = fVar229 * fVar130;
                              auVar70._8_4_ = fVar231 * fVar267;
                              auVar70._12_4_ = fVar233 * fVar270;
                              auVar83 = vsubps_avx(auVar70,auVar260);
                              fVar107 = *(float *)(ray + 0x60);
                              fVar130 = *(float *)(ray + 100);
                              fVar267 = *(float *)(ray + 0x68);
                              auVar278 = *(undefined1 (*) [12])(ray + 0x60);
                              fVar270 = *(float *)(ray + 0x6c);
                              auVar150 = *(undefined1 (*) [16])(ray + 0x50);
                              fVar232 = auVar150._0_4_;
                              fVar209 = auVar150._4_4_;
                              fVar212 = auVar150._8_4_;
                              fVar215 = auVar150._12_4_;
                              fVar253 = *(float *)(ray + 0x40);
                              fVar265 = *(float *)(ray + 0x44);
                              fVar268 = *(float *)(ray + 0x48);
                              fVar271 = *(float *)(ray + 0x4c);
                              local_1c08 = auVar23._0_4_;
                              fStack_1c04 = auVar23._4_4_;
                              fStack_1c00 = auVar23._8_4_;
                              fStack_1bfc = auVar23._12_4_;
                              auVar276._0_4_ =
                                   fVar253 * local_1c08 +
                                   fVar107 * auVar83._0_4_ + fVar232 * auVar82._0_4_;
                              auVar276._4_4_ =
                                   fVar265 * fStack_1c04 +
                                   fVar130 * auVar83._4_4_ + fVar209 * auVar82._4_4_;
                              auVar276._8_4_ =
                                   fVar268 * fStack_1c00 +
                                   fVar267 * auVar83._8_4_ + fVar212 * auVar82._8_4_;
                              auVar276._12_4_ =
                                   fVar271 * fStack_1bfc +
                                   fVar270 * auVar83._12_4_ + fVar215 * auVar82._12_4_;
                              auVar150 = vsubps_avx(auVar206,auVar235);
                              auVar206 = vsubps_avx(auVar95,auVar255);
                              fVar81 = fVar242 + auVar235._0_4_;
                              fVar213 = fVar250 + auVar235._4_4_;
                              fVar105 = fVar54 + auVar235._8_4_;
                              fVar264 = fVar199 + auVar235._12_4_;
                              fVar172 = fVar289 + auVar255._0_4_;
                              fVar200 = fVar294 + auVar255._4_4_;
                              fVar208 = fVar296 + auVar255._8_4_;
                              fVar211 = fVar298 + auVar255._12_4_;
                              fVar254 = auVar206._0_4_;
                              auVar293._0_4_ = fVar254 * fVar81;
                              fVar266 = auVar206._4_4_;
                              auVar293._4_4_ = fVar266 * fVar213;
                              fVar269 = auVar206._8_4_;
                              auVar293._8_4_ = fVar269 * fVar105;
                              fVar272 = auVar206._12_4_;
                              auVar293._12_4_ = fVar272 * fVar264;
                              fVar214 = auVar150._0_4_;
                              auVar193._0_4_ = fVar214 * fVar172;
                              fVar106 = auVar150._4_4_;
                              auVar193._4_4_ = fVar106 * fVar200;
                              fVar129 = auVar150._8_4_;
                              auVar193._8_4_ = fVar129 * fVar208;
                              fVar131 = auVar150._12_4_;
                              auVar193._12_4_ = fVar131 * fVar211;
                              auVar150 = vsubps_avx(auVar193,auVar293);
                              auVar122 = vsubps_avx(auVar122,auVar234);
                              fVar292 = auVar122._0_4_;
                              auVar182._0_4_ = fVar292 * fVar172;
                              fVar295 = auVar122._4_4_;
                              auVar182._4_4_ = fVar295 * fVar200;
                              fVar297 = auVar122._8_4_;
                              auVar182._8_4_ = fVar297 * fVar208;
                              fVar299 = auVar122._12_4_;
                              auVar182._12_4_ = fVar299 * fVar211;
                              fVar172 = auVar234._0_4_ + fVar249;
                              fVar200 = auVar234._4_4_ + fVar251;
                              fVar208 = auVar234._8_4_ + fVar80;
                              fVar211 = auVar234._12_4_ + fVar207;
                              auVar261._0_4_ = fVar172 * fVar254;
                              auVar261._4_4_ = fVar200 * fVar266;
                              auVar261._8_4_ = fVar208 * fVar269;
                              auVar261._12_4_ = fVar211 * fVar272;
                              auVar206 = vsubps_avx(auVar261,auVar182);
                              auVar223._0_4_ = fVar172 * fVar214;
                              auVar223._4_4_ = fVar200 * fVar106;
                              auVar223._8_4_ = fVar208 * fVar129;
                              auVar223._12_4_ = fVar211 * fVar131;
                              auVar71._0_4_ = fVar292 * fVar81;
                              auVar71._4_4_ = fVar295 * fVar213;
                              auVar71._8_4_ = fVar297 * fVar105;
                              auVar71._12_4_ = fVar299 * fVar264;
                              auVar95 = vsubps_avx(auVar71,auVar223);
                              auVar262._0_4_ =
                                   fVar253 * auVar150._0_4_ +
                                   fVar107 * auVar95._0_4_ + fVar232 * auVar206._0_4_;
                              auVar262._4_4_ =
                                   fVar265 * auVar150._4_4_ +
                                   fVar130 * auVar95._4_4_ + fVar209 * auVar206._4_4_;
                              auVar262._8_4_ =
                                   fVar268 * auVar150._8_4_ +
                                   fVar267 * auVar95._8_4_ + fVar212 * auVar206._8_4_;
                              auVar262._12_4_ =
                                   fVar271 * auVar150._12_4_ +
                                   fVar270 * auVar95._12_4_ + fVar215 * auVar206._12_4_;
                              auVar150 = vsubps_avx(auVar234,auVar22);
                              fVar281 = auVar234._0_4_ + auVar22._0_4_;
                              fVar286 = auVar234._4_4_ + auVar22._4_4_;
                              fVar288 = auVar234._8_4_ + auVar22._8_4_;
                              fVar290 = auVar234._12_4_ + auVar22._12_4_;
                              auVar206 = vsubps_avx(auVar235,auVar79);
                              fVar149 = auVar235._0_4_ + auVar79._0_4_;
                              fVar169 = auVar235._4_4_ + auVar79._4_4_;
                              fVar170 = auVar235._8_4_ + auVar79._8_4_;
                              fVar171 = auVar235._12_4_ + auVar79._12_4_;
                              auVar79 = vsubps_avx(auVar255,auVar94);
                              fVar200 = auVar255._0_4_ + auVar94._0_4_;
                              fVar208 = auVar255._4_4_ + auVar94._4_4_;
                              fVar211 = auVar255._8_4_ + auVar94._8_4_;
                              fVar132 = auVar255._12_4_ + auVar94._12_4_;
                              fVar81 = auVar79._0_4_;
                              auVar194._0_4_ = fVar149 * fVar81;
                              fVar213 = auVar79._4_4_;
                              auVar194._4_4_ = fVar169 * fVar213;
                              fVar105 = auVar79._8_4_;
                              auVar194._8_4_ = fVar170 * fVar105;
                              fVar264 = auVar79._12_4_;
                              auVar194._12_4_ = fVar171 * fVar264;
                              fVar279 = auVar206._0_4_;
                              auVar224._0_4_ = fVar279 * fVar200;
                              fVar280 = auVar206._4_4_;
                              auVar224._4_4_ = fVar280 * fVar208;
                              fVar285 = auVar206._8_4_;
                              auVar224._8_4_ = fVar285 * fVar211;
                              fVar287 = auVar206._12_4_;
                              auVar224._12_4_ = fVar287 * fVar132;
                              auVar79 = vsubps_avx(auVar224,auVar194);
                              fVar172 = auVar150._0_4_;
                              auVar116._0_4_ = fVar172 * fVar200;
                              fVar200 = auVar150._4_4_;
                              auVar116._4_4_ = fVar200 * fVar208;
                              fVar208 = auVar150._8_4_;
                              auVar116._8_4_ = fVar208 * fVar211;
                              fVar211 = auVar150._12_4_;
                              auVar116._12_4_ = fVar211 * fVar132;
                              auVar225._0_4_ = fVar281 * fVar81;
                              auVar225._4_4_ = fVar286 * fVar213;
                              auVar225._8_4_ = fVar288 * fVar105;
                              auVar225._12_4_ = fVar290 * fVar264;
                              auVar150 = vsubps_avx(auVar225,auVar116);
                              auVar163._0_4_ = fVar279 * fVar281;
                              auVar163._4_4_ = fVar280 * fVar286;
                              auVar163._8_4_ = fVar285 * fVar288;
                              auVar163._12_4_ = fVar287 * fVar290;
                              auVar183._0_4_ = fVar172 * fVar149;
                              auVar183._4_4_ = fVar200 * fVar169;
                              auVar183._8_4_ = fVar208 * fVar170;
                              auVar183._12_4_ = fVar211 * fVar171;
                              auVar94 = vsubps_avx(auVar183,auVar163);
                              auVar117._0_4_ =
                                   fVar253 * auVar79._0_4_ +
                                   fVar107 * auVar94._0_4_ + fVar232 * auVar150._0_4_;
                              auVar117._4_4_ =
                                   fVar265 * auVar79._4_4_ +
                                   fVar130 * auVar94._4_4_ + fVar209 * auVar150._4_4_;
                              auVar117._8_4_ =
                                   fVar268 * auVar79._8_4_ +
                                   fVar267 * auVar94._8_4_ + fVar212 * auVar150._8_4_;
                              auVar117._12_4_ =
                                   fVar271 * auVar79._12_4_ +
                                   fVar270 * auVar94._12_4_ + fVar215 * auVar150._12_4_;
                              auVar226._0_4_ = auVar117._0_4_ + auVar276._0_4_ + auVar262._0_4_;
                              auVar226._4_4_ = auVar117._4_4_ + auVar276._4_4_ + auVar262._4_4_;
                              auVar226._8_4_ = auVar117._8_4_ + auVar276._8_4_ + auVar262._8_4_;
                              auVar226._12_4_ = auVar117._12_4_ + auVar276._12_4_ + auVar262._12_4_;
                              auVar150 = vminps_avx(auVar276,auVar262);
                              auVar79 = vminps_avx(auVar150,auVar117);
                              auVar241._8_4_ = 0x7fffffff;
                              auVar241._0_8_ = 0x7fffffff7fffffff;
                              auVar241._12_4_ = 0x7fffffff;
                              auVar150 = vandps_avx(auVar226,auVar241);
                              auVar184._0_4_ = auVar150._0_4_ * 1.1920929e-07;
                              auVar184._4_4_ = auVar150._4_4_ * 1.1920929e-07;
                              auVar184._8_4_ = auVar150._8_4_ * 1.1920929e-07;
                              auVar184._12_4_ = auVar150._12_4_ * 1.1920929e-07;
                              uVar44 = CONCAT44(auVar184._4_4_,auVar184._0_4_);
                              auVar195._0_8_ = uVar44 ^ 0x8000000080000000;
                              auVar195._8_4_ = -auVar184._8_4_;
                              auVar195._12_4_ = -auVar184._12_4_;
                              auVar79 = vcmpps_avx(auVar79,auVar195,5);
                              auVar94 = vmaxps_avx(auVar276,auVar262);
                              auVar94 = vmaxps_avx(auVar94,auVar117);
                              auVar104 = ZEXT1664(auVar190);
                              auVar94 = vcmpps_avx(auVar94,auVar184,2);
                              auVar79 = vorps_avx(auVar79,auVar94);
                              auVar128 = ZEXT1664(auVar79);
                              auVar94 = auVar190 & auVar79;
                              if ((((auVar94 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0 &&
                                   (auVar94 >> 0x3f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar94 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && -1 < auVar94[0xf]) {
                                auVar263 = ZEXT1664(CONCAT412(0x7f800000,
                                                              CONCAT48(0x7f800000,0x7f8000007f800000
                                                                      )));
                              }
                              else {
                                auVar128 = ZEXT1664(auVar206);
                                auVar164._0_4_ = fVar214 * fVar55;
                                auVar164._4_4_ = fVar106 * fVar210;
                                auVar164._8_4_ = fVar129 * fVar21;
                                auVar164._12_4_ = fVar131 * fVar252;
                                auVar185._0_4_ = fVar189 * fVar254;
                                auVar185._4_4_ = fVar216 * fVar266;
                                auVar185._8_4_ = fVar228 * fVar269;
                                auVar185._12_4_ = fVar230 * fVar272;
                                auVar95 = vsubps_avx(auVar185,auVar164);
                                auVar196._0_4_ = fVar279 * fVar254;
                                auVar196._4_4_ = fVar280 * fVar266;
                                auVar196._8_4_ = fVar285 * fVar269;
                                auVar196._12_4_ = fVar287 * fVar272;
                                auVar227._0_4_ = fVar214 * fVar81;
                                auVar227._4_4_ = fVar106 * fVar213;
                                auVar227._8_4_ = fVar129 * fVar105;
                                auVar227._12_4_ = fVar131 * fVar264;
                                auVar234 = vsubps_avx(auVar227,auVar196);
                                auVar94 = vandps_avx(auVar241,auVar164);
                                auVar206 = vandps_avx(auVar241,auVar196);
                                auVar94 = vcmpps_avx(auVar94,auVar206,1);
                                auVar104 = ZEXT1664(auVar190);
                                aVar19 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                         vblendvps_avx(auVar234,auVar95,auVar94);
                                auVar139._0_4_ = fVar292 * fVar81;
                                auVar139._4_4_ = fVar295 * fVar213;
                                auVar139._8_4_ = fVar297 * fVar105;
                                auVar139._12_4_ = fVar299 * fVar264;
                                auVar165._0_4_ = fVar292 * fVar55;
                                auVar165._4_4_ = fVar295 * fVar210;
                                auVar165._8_4_ = fVar297 * fVar21;
                                auVar165._12_4_ = fVar299 * fVar252;
                                auVar186._0_4_ = fVar217 * fVar254;
                                auVar186._4_4_ = fVar229 * fVar266;
                                auVar186._8_4_ = fVar231 * fVar269;
                                auVar186._12_4_ = fVar233 * fVar272;
                                auVar95 = vsubps_avx(auVar165,auVar186);
                                auVar97._0_4_ = fVar172 * fVar254;
                                auVar97._4_4_ = fVar200 * fVar266;
                                auVar97._8_4_ = fVar208 * fVar269;
                                auVar97._12_4_ = fVar211 * fVar272;
                                auVar234 = vsubps_avx(auVar97,auVar139);
                                auVar94 = vandps_avx(auVar241,auVar186);
                                auVar206 = vandps_avx(auVar241,auVar139);
                                auVar94 = vcmpps_avx(auVar94,auVar206,1);
                                auVar95 = vblendvps_avx(auVar234,auVar95,auVar94);
                                auVar72._0_4_ = fVar214 * fVar172;
                                auVar72._4_4_ = fVar106 * fVar200;
                                auVar72._8_4_ = fVar129 * fVar208;
                                auVar72._12_4_ = fVar131 * fVar211;
                                auVar98._0_4_ = fVar214 * fVar217;
                                auVar98._4_4_ = fVar106 * fVar229;
                                auVar98._8_4_ = fVar129 * fVar231;
                                auVar98._12_4_ = fVar131 * fVar233;
                                auVar140._0_4_ = fVar292 * fVar189;
                                auVar140._4_4_ = fVar295 * fVar216;
                                auVar140._8_4_ = fVar297 * fVar228;
                                auVar140._12_4_ = fVar299 * fVar230;
                                auVar166._0_4_ = fVar292 * fVar279;
                                auVar166._4_4_ = fVar295 * fVar280;
                                auVar166._8_4_ = fVar297 * fVar285;
                                auVar166._12_4_ = fVar299 * fVar287;
                                auVar234 = vsubps_avx(auVar98,auVar140);
                                auVar235 = vsubps_avx(auVar166,auVar72);
                                auVar94 = vandps_avx(auVar241,auVar140);
                                auVar206 = vandps_avx(auVar241,auVar72);
                                auVar94 = vcmpps_avx(auVar94,auVar206,1);
                                auVar94 = vblendvps_avx(auVar235,auVar234,auVar94);
                                local_1bc8 = auVar278._0_4_;
                                fStack_1bc4 = auVar278._4_4_;
                                fStack_1bc0 = auVar278._8_4_;
                                fVar55 = aVar19.v[0] * fVar253 +
                                         auVar94._0_4_ * local_1bc8 + auVar95._0_4_ * fVar232;
                                fVar81 = aVar19.v[1] * fVar265 +
                                         auVar94._4_4_ * fStack_1bc4 + auVar95._4_4_ * fVar209;
                                fVar210 = aVar19.v[2] * fVar268 +
                                          auVar94._8_4_ * fStack_1bc0 + auVar95._8_4_ * fVar212;
                                fVar213 = aVar19.v[3] * fVar271 +
                                          auVar94._12_4_ * fVar270 + auVar95._12_4_ * fVar215;
                                auVar73._0_4_ = fVar55 + fVar55;
                                auVar73._4_4_ = fVar81 + fVar81;
                                auVar73._8_4_ = fVar210 + fVar210;
                                auVar73._12_4_ = fVar213 + fVar213;
                                fVar55 = aVar19.v[0] * fVar249 +
                                         auVar94._0_4_ * fVar289 + auVar95._0_4_ * fVar242;
                                fVar81 = aVar19.v[1] * fVar251 +
                                         auVar94._4_4_ * fVar294 + auVar95._4_4_ * fVar250;
                                fVar54 = aVar19.v[2] * fVar80 +
                                         auVar94._8_4_ * fVar296 + auVar95._8_4_ * fVar54;
                                fVar80 = aVar19.v[3] * fVar207 +
                                         auVar94._12_4_ * fVar298 + auVar95._12_4_ * fVar199;
                                auVar94 = vrcpps_avx(auVar73);
                                fVar242 = auVar94._0_4_;
                                auVar167._0_4_ = auVar73._0_4_ * fVar242;
                                fVar249 = auVar94._4_4_;
                                auVar167._4_4_ = auVar73._4_4_ * fVar249;
                                fVar250 = auVar94._8_4_;
                                auVar167._8_4_ = auVar73._8_4_ * fVar250;
                                fVar251 = auVar94._12_4_;
                                auVar167._12_4_ = auVar73._12_4_ * fVar251;
                                auVar187._8_4_ = 0x3f800000;
                                auVar187._0_8_ = 0x3f8000003f800000;
                                auVar187._12_4_ = 0x3f800000;
                                auVar94 = vsubps_avx(auVar187,auVar167);
                                auVar188._0_4_ =
                                     (fVar55 + fVar55) * (fVar242 + fVar242 * auVar94._0_4_);
                                auVar188._4_4_ =
                                     (fVar81 + fVar81) * (fVar249 + fVar249 * auVar94._4_4_);
                                auVar188._8_4_ =
                                     (fVar54 + fVar54) * (fVar250 + fVar250 * auVar94._8_4_);
                                auVar188._12_4_ =
                                     (fVar80 + fVar80) * (fVar251 + fVar251 * auVar94._12_4_);
                                auVar94 = vcmpps_avx(auVar188,*(undefined1 (*) [16])(ray + 0x80),2);
                                auVar206 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar188,2)
                                ;
                                auVar94 = vandps_avx(auVar206,auVar94);
                                auVar95 = SUB6416(ZEXT864(0),0) << 0x20;
                                auVar206 = vcmpps_avx(auVar73,ZEXT816(0) << 0x20,4);
                                auVar94 = vandps_avx(auVar206,auVar94);
                                auVar79 = vandps_avx(auVar190,auVar79);
                                auVar94 = vpslld_avx(auVar94,0x1f);
                                auVar206 = vpsrad_avx(auVar94,0x1f);
                                auVar94 = auVar79 & auVar206;
                                auVar263 = ZEXT1664(CONCAT412(0x7f800000,
                                                              CONCAT48(0x7f800000,0x7f8000007f800000
                                                                      )));
                                if ((((auVar94 >> 0x1f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar94 >> 0x3f & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar94 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar94[0xf] < '\0') {
                                  auVar79 = vandps_avx(auVar206,auVar79);
                                  pGVar14 = (context->scene->geometries).items
                                            [(uint)lower_z.field_0.i[uVar38]].ptr;
                                  uVar31 = pGVar14->mask;
                                  auVar74._4_4_ = uVar31;
                                  auVar74._0_4_ = uVar31;
                                  auVar74._8_4_ = uVar31;
                                  auVar74._12_4_ = uVar31;
                                  auVar94 = vandps_avx(auVar74,*(undefined1 (*) [16])(ray + 0x90));
                                  auVar94 = vpcmpeqd_avx(auVar94,ZEXT816(0) << 0x20);
                                  auVar206 = auVar79 & ~auVar94;
                                  if ((((auVar206 >> 0x1f & (undefined1  [16])0x1) !=
                                        (undefined1  [16])0x0 ||
                                       (auVar206 >> 0x3f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                      (auVar206 >> 0x5f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) || auVar206[0xf] < '\0') {
                                    aVar168 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                              vandnps_avx(auVar94,auVar79);
                                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                       (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                      auVar206 = vsubps_avx(auVar226,auVar276);
                                      auVar120._0_4_ =
                                           (float)(int)(*(ushort *)(lVar15 + 8 + lVar34) - 1);
                                      auVar278 = auVar122._4_12_;
                                      auVar120._4_12_ = auVar278;
                                      auVar94 = vrcpss_avx(auVar120,auVar120);
                                      auVar144._0_4_ = (float)(((uint)uVar38 & 1) + uVar46);
                                      auVar144._4_12_ = auVar278;
                                      auVar122 = vshufps_avx(auVar144,auVar144,0);
                                      auVar94 = ZEXT416((uint)(auVar94._0_4_ *
                                                              (2.0 - auVar94._0_4_ * auVar120._0_4_)
                                                              ));
                                      auVar94 = vshufps_avx(auVar94,auVar94,0);
                                      auVar121._0_4_ =
                                           (auVar206._0_4_ + auVar226._0_4_ * auVar122._0_4_) *
                                           auVar94._0_4_;
                                      auVar121._4_4_ =
                                           (auVar206._4_4_ + auVar226._4_4_ * auVar122._4_4_) *
                                           auVar94._4_4_;
                                      auVar121._8_4_ =
                                           (auVar206._8_4_ + auVar226._8_4_ * auVar122._8_4_) *
                                           auVar94._8_4_;
                                      auVar121._12_4_ =
                                           (auVar206._12_4_ + auVar226._12_4_ * auVar122._12_4_) *
                                           auVar94._12_4_;
                                      auVar145._0_4_ =
                                           (float)(int)(*(ushort *)(lVar15 + 10 + lVar34) - 1);
                                      auVar145._4_12_ = auVar278;
                                      auVar94 = vblendvps_avx(auVar206,auVar121,auVar79);
                                      auVar122 = vrcpss_avx(auVar145,auVar145);
                                      auVar146._0_4_ =
                                           (float)(int)(((uint)(uVar38 >> 1) & 0x7fffffff) + uVar47)
                                      ;
                                      auVar146._4_12_ = auVar278;
                                      auVar234 = vsubps_avx(auVar226,auVar262);
                                      auVar206 = vshufps_avx(auVar146,auVar146,0);
                                      auVar122 = ZEXT416((uint)(auVar122._0_4_ *
                                                               (2.0 - auVar122._0_4_ *
                                                                      auVar145._0_4_)));
                                      auVar122 = vshufps_avx(auVar122,auVar122,0);
                                      auVar123._0_4_ =
                                           (auVar234._0_4_ + auVar226._0_4_ * auVar206._0_4_) *
                                           auVar122._0_4_;
                                      auVar123._4_4_ =
                                           (auVar234._4_4_ + auVar226._4_4_ * auVar206._4_4_) *
                                           auVar122._4_4_;
                                      auVar123._8_4_ =
                                           (auVar234._8_4_ + auVar226._8_4_ * auVar206._8_4_) *
                                           auVar122._8_4_;
                                      auVar123._12_4_ =
                                           (auVar234._12_4_ + auVar226._12_4_ * auVar206._12_4_) *
                                           auVar122._12_4_;
                                      auVar122 = vblendvps_avx(auVar234,auVar123,auVar79);
                                      auVar79 = vrcpps_avx(auVar226);
                                      fVar242 = auVar79._0_4_;
                                      auVar147._0_4_ = auVar226._0_4_ * fVar242;
                                      fVar249 = auVar79._4_4_;
                                      auVar147._4_4_ = auVar226._4_4_ * fVar249;
                                      fVar250 = auVar79._8_4_;
                                      auVar147._8_4_ = auVar226._8_4_ * fVar250;
                                      fVar251 = auVar79._12_4_;
                                      auVar147._12_4_ = auVar226._12_4_ * fVar251;
                                      auVar198._8_4_ = 0x3f800000;
                                      auVar198._0_8_ = 0x3f8000003f800000;
                                      auVar198._12_4_ = 0x3f800000;
                                      auVar79 = vsubps_avx(auVar198,auVar147);
                                      auVar124._0_4_ = fVar242 + fVar242 * auVar79._0_4_;
                                      auVar124._4_4_ = fVar249 + fVar249 * auVar79._4_4_;
                                      auVar124._8_4_ = fVar250 + fVar250 * auVar79._8_4_;
                                      auVar124._12_4_ = fVar251 + fVar251 * auVar79._12_4_;
                                      auVar148._8_4_ = 0x219392ef;
                                      auVar148._0_8_ = 0x219392ef219392ef;
                                      auVar148._12_4_ = 0x219392ef;
                                      auVar150 = vcmpps_avx(auVar150,auVar148,5);
                                      auVar79 = vandps_avx(auVar150,auVar124);
                                      auVar128 = ZEXT1664(auVar79);
                                      auVar78._0_4_ = auVar94._0_4_ * auVar79._0_4_;
                                      auVar78._4_4_ = auVar94._4_4_ * auVar79._4_4_;
                                      auVar78._8_4_ = auVar94._8_4_ * auVar79._8_4_;
                                      auVar78._12_4_ = auVar94._12_4_ * auVar79._12_4_;
                                      auVar102._0_4_ = auVar122._0_4_ * auVar79._0_4_;
                                      auVar102._4_4_ = auVar122._4_4_ * auVar79._4_4_;
                                      auVar102._8_4_ = auVar122._8_4_ * auVar79._8_4_;
                                      auVar102._12_4_ = auVar122._12_4_ * auVar79._12_4_;
                                      upper_x.field_0 = aVar19;
                                      vminps_avx(auVar78,auVar198);
                                      vminps_avx(auVar102,auVar198);
                                      vpshufd_avx(ZEXT416((uint)upper_z.field_0.i[uVar38]),0);
                                      auVar150 = vpshufd_avx(ZEXT416((uint)lower_z.field_0.i[uVar38]
                                                                    ),0);
                                      vcmpps_avx(ZEXT1632(auVar150),ZEXT1632(auVar150),0xf);
                                      auVar150 = *(undefined1 (*) [16])(ray + 0x80);
                                      auVar94 = vblendvps_avx(auVar150,auVar188,
                                                              (undefined1  [16])aVar168);
                                      *(undefined1 (*) [16])(ray + 0x80) = auVar94;
                                      upper_y.field_0 = aVar168;
                                      lower_y.field_0._0_8_ = &upper_y;
                                      lower_y.field_0._8_8_ = pGVar14->userPtr;
                                      if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                        auVar128 = ZEXT1664(auVar79);
                                        auVar277._0_8_ =
                                             (*pGVar14->occlusionFilterN)
                                                       ((RTCFilterFunctionNArguments *)&lower_y);
                                        auVar277._8_56_ = extraout_var_01;
                                        auVar94 = auVar277._0_16_;
                                        auVar95 = ZEXT816(0) << 0x40;
                                        auVar263 = ZEXT1664(CONCAT412(0x7f800000,
                                                                      CONCAT48(0x7f800000,
                                                                               0x7f8000007f800000)))
                                        ;
                                      }
                                      if (upper_y.field_0 ==
                                          (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0) {
                                        auVar79 = vpcmpeqd_avx((undefined1  [16])0x0,auVar95);
                                        auVar79 = auVar79 ^ _DAT_01f7ae20;
                                      }
                                      else {
                                        p_Var17 = context->args->filter;
                                        if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                                           (((context->args->flags &
                                             RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                            (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                                          auVar284._0_8_ =
                                               (*p_Var17)((RTCFilterFunctionNArguments *)&lower_y);
                                          auVar284._8_56_ = extraout_var_02;
                                          auVar94 = auVar284._0_16_;
                                          auVar95 = ZEXT816(0) << 0x40;
                                          auVar263 = ZEXT1664(CONCAT412(0x7f800000,
                                                                        CONCAT48(0x7f800000,
                                                                                 0x7f8000007f800000)
                                                                       ));
                                        }
                                        auVar122 = vpcmpeqd_avx((undefined1  [16])upper_y.field_0,
                                                                auVar95);
                                        auVar79 = vpcmpeqd_avx(auVar94,auVar94);
                                        auVar79 = auVar122 ^ auVar79;
                                        auVar126._8_4_ = 0xff800000;
                                        auVar126._0_8_ = 0xff800000ff800000;
                                        auVar126._12_4_ = 0xff800000;
                                        auVar128 = ZEXT1664(auVar126);
                                        auVar94 = vblendvps_avx(auVar126,*(undefined1 (*) [16])
                                                                          (ray + 0x80),auVar122);
                                        *(undefined1 (*) [16])(ray + 0x80) = auVar94;
                                      }
                                      auVar79 = vpslld_avx(auVar79,0x1f);
                                      aVar168 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                                vpsrad_avx(auVar79,0x1f);
                                      auVar150 = vblendvps_avx(auVar150,*(undefined1 (*) [16])pRVar1
                                                               ,auVar79);
                                      *(undefined1 (*) [16])pRVar1 = auVar150;
                                    }
                                    auVar150 = vpandn_avx((undefined1  [16])aVar168,auVar190);
                                    auVar104 = ZEXT1664(auVar150);
                                  }
                                }
                              }
                            }
                            auVar150 = auVar104._0_16_;
                            if ((((auVar150 >> 0x1f & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0 &&
                                 (auVar150 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 ) && (auVar150 >> 0x5f & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) && -1 < auVar104[0xf]) break;
                            puVar48 = puVar48 + 8;
                            bVar53 = uVar38 < 3;
                            uVar38 = uVar38 + 1;
                          } while (bVar53);
                          auVar57 = local_1b18 & auVar150;
                          bVar53 = (((auVar57 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0 &&
                                    (auVar57 >> 0x3f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar57 >> 0x5f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) && -1 < auVar57[0xf];
                          local_1b18 = vandps_avx(auVar150,local_1b18);
                          auVar277 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                        CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                          auVar284 = ZEXT1664(CONCAT412(0x3f800003,
                                                        CONCAT48(0x3f800003,0x3f8000033f800003)));
                        }
                      } while ((!bVar53) && (uVar43 = uVar43 & uVar43 - 1, uVar43 != 0));
                    }
                    lVar36 = lVar36 + 1;
                  } while (lVar36 != uVar51 - 8);
                  auVar57 = vpcmpeqd_avx(auVar128._0_16_,auVar128._0_16_);
                  aVar24 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar57 ^ local_1b18);
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vpor_avx((undefined1  [16])terminated.field_0,(undefined1  [16])aVar24);
                auVar57 = auVar57 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar57 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar57 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar57[0xf]) goto LAB_0030d446;
                auVar127._8_4_ = 0xff800000;
                auVar127._0_8_ = 0xff800000ff800000;
                auVar127._12_4_ = 0xff800000;
                auVar128 = ZEXT1664(auVar127);
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar127,
                                   (undefined1  [16])terminated.field_0);
              }
              goto LAB_0030bc18;
            }
            lVar36 = 0;
            sVar42 = 8;
            auVar57 = auVar263._0_16_;
            do {
              sVar40 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar36 * 8);
              if (sVar40 == 8) {
                auVar104 = ZEXT1664(auVar57);
                sVar40 = sVar42;
                break;
              }
              uVar32 = *(undefined4 *)(root.ptr + 0x20 + lVar36 * 4);
              auVar82._4_4_ = uVar32;
              auVar82._0_4_ = uVar32;
              auVar82._8_4_ = uVar32;
              auVar82._12_4_ = uVar32;
              auVar79._8_8_ = tray.org.field_0._8_8_;
              auVar79._0_8_ = tray.org.field_0._0_8_;
              auVar22._8_8_ = tray.org.field_0._24_8_;
              auVar22._0_8_ = tray.org.field_0._16_8_;
              auVar23._8_8_ = tray.org.field_0._40_8_;
              auVar23._0_8_ = tray.org.field_0._32_8_;
              auVar133 = vsubps_avx(auVar82,auVar79);
              auVar191._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar133._0_4_;
              auVar191._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar133._4_4_;
              auVar191._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar133._8_4_;
              auVar191._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar133._12_4_;
              uVar32 = *(undefined4 *)(root.ptr + 0x40 + lVar36 * 4);
              auVar83._4_4_ = uVar32;
              auVar83._0_4_ = uVar32;
              auVar83._8_4_ = uVar32;
              auVar83._12_4_ = uVar32;
              auVar133 = vsubps_avx(auVar83,auVar22);
              auVar218._0_4_ = tray.rdir.field_0._16_4_ * auVar133._0_4_;
              auVar218._4_4_ = tray.rdir.field_0._20_4_ * auVar133._4_4_;
              auVar218._8_4_ = tray.rdir.field_0._24_4_ * auVar133._8_4_;
              auVar218._12_4_ = tray.rdir.field_0._28_4_ * auVar133._12_4_;
              uVar32 = *(undefined4 *)(root.ptr + 0x60 + lVar36 * 4);
              auVar84._4_4_ = uVar32;
              auVar84._0_4_ = uVar32;
              auVar84._8_4_ = uVar32;
              auVar84._12_4_ = uVar32;
              auVar133 = vsubps_avx(auVar84,auVar23);
              auVar243._0_4_ = tray.rdir.field_0._32_4_ * auVar133._0_4_;
              auVar243._4_4_ = tray.rdir.field_0._36_4_ * auVar133._4_4_;
              auVar243._8_4_ = tray.rdir.field_0._40_4_ * auVar133._8_4_;
              auVar243._12_4_ = tray.rdir.field_0._44_4_ * auVar133._12_4_;
              uVar32 = *(undefined4 *)(root.ptr + 0x30 + lVar36 * 4);
              auVar85._4_4_ = uVar32;
              auVar85._0_4_ = uVar32;
              auVar85._8_4_ = uVar32;
              auVar85._12_4_ = uVar32;
              auVar133 = vsubps_avx(auVar85,auVar79);
              auVar108._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar133._0_4_;
              auVar108._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar133._4_4_;
              auVar108._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar133._8_4_;
              auVar108._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar133._12_4_;
              uVar32 = *(undefined4 *)(root.ptr + 0x50 + lVar36 * 4);
              auVar86._4_4_ = uVar32;
              auVar86._0_4_ = uVar32;
              auVar86._8_4_ = uVar32;
              auVar86._12_4_ = uVar32;
              auVar133 = vsubps_avx(auVar86,auVar22);
              auVar134._0_4_ = tray.rdir.field_0._16_4_ * auVar133._0_4_;
              auVar134._4_4_ = tray.rdir.field_0._20_4_ * auVar133._4_4_;
              auVar134._8_4_ = tray.rdir.field_0._24_4_ * auVar133._8_4_;
              auVar134._12_4_ = tray.rdir.field_0._28_4_ * auVar133._12_4_;
              uVar32 = *(undefined4 *)(root.ptr + 0x70 + lVar36 * 4);
              auVar87._4_4_ = uVar32;
              auVar87._0_4_ = uVar32;
              auVar87._8_4_ = uVar32;
              auVar87._12_4_ = uVar32;
              auVar133 = vsubps_avx(auVar87,auVar23);
              auVar151._0_4_ = tray.rdir.field_0._32_4_ * auVar133._0_4_;
              auVar151._4_4_ = tray.rdir.field_0._36_4_ * auVar133._4_4_;
              auVar151._8_4_ = tray.rdir.field_0._40_4_ * auVar133._8_4_;
              auVar151._12_4_ = tray.rdir.field_0._44_4_ * auVar133._12_4_;
              auVar133 = vminps_avx(auVar191,auVar108);
              auVar150 = vminps_avx(auVar218,auVar134);
              auVar133 = vmaxps_avx(auVar133,auVar150);
              auVar150 = vminps_avx(auVar243,auVar151);
              auVar133 = vmaxps_avx(auVar133,auVar150);
              auVar88._0_4_ = auVar277._0_4_ * auVar133._0_4_;
              auVar88._4_4_ = auVar277._4_4_ * auVar133._4_4_;
              auVar88._8_4_ = auVar277._8_4_ * auVar133._8_4_;
              auVar88._12_4_ = auVar277._12_4_ * auVar133._12_4_;
              auVar133 = vmaxps_avx(auVar191,auVar108);
              auVar150 = vmaxps_avx(auVar218,auVar134);
              auVar150 = vminps_avx(auVar133,auVar150);
              auVar133 = vmaxps_avx(auVar243,auVar151);
              auVar133 = vminps_avx(auVar150,auVar133);
              auVar109._0_4_ = auVar284._0_4_ * auVar133._0_4_;
              auVar109._4_4_ = auVar284._4_4_ * auVar133._4_4_;
              auVar109._8_4_ = auVar284._8_4_ * auVar133._8_4_;
              auVar109._12_4_ = auVar284._12_4_ * auVar133._12_4_;
              auVar133 = vmaxps_avx(auVar88,(undefined1  [16])tray.tnear.field_0);
              auVar150 = vminps_avx(auVar109,(undefined1  [16])tray.tfar.field_0);
              auVar133 = vcmpps_avx(auVar133,auVar150,2);
              auVar128 = ZEXT1664(auVar133);
              if ((((auVar133 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar133 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar133 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar133[0xf]) {
                auVar104 = ZEXT1664(auVar57);
                sVar40 = sVar42;
              }
              else {
                auVar133 = vblendvps_avx(auVar263._0_16_,auVar88,auVar133);
                auVar104 = ZEXT1664(auVar133);
                if (sVar42 != 8) {
                  pNVar52->ptr = sVar42;
                  pNVar52 = pNVar52 + 1;
                  *(undefined1 (*) [16])paVar49->v = auVar57;
                  paVar49 = paVar49 + 1;
                }
              }
              lVar36 = lVar36 + 1;
              auVar57 = auVar104._0_16_;
              sVar42 = sVar40;
            } while (lVar36 != 4);
            if (sVar40 == 8) goto LAB_0030bddf;
            auVar57 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar104._0_16_,6);
            uVar32 = vmovmskps_avx(auVar57);
            root.ptr = sVar40;
          } while ((byte)uVar35 < (byte)POPCOUNT(uVar32));
          pNVar52->ptr = sVar40;
          pNVar52 = pNVar52 + 1;
          *paVar49 = auVar104._0_16_;
          paVar49 = paVar49 + 1;
LAB_0030bddf:
          iVar33 = 4;
        }
        else {
          do {
            sVar42 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> sVar42 & 1) == 0; sVar42 = sVar42 + 1) {
              }
            }
            auVar128 = ZEXT1664(auVar128._0_16_);
            bVar53 = occluded1(This,bvh,root,sVar42,&pre,ray,&tray,context);
            if (bVar53) {
              terminated.field_0.i[sVar42] = -1;
            }
            uVar51 = uVar51 & uVar51 - 1;
          } while (uVar51 != 0);
          auVar57 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
          iVar33 = 3;
          if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar57[0xf] < '\0') {
            auVar57._8_4_ = 0xff800000;
            auVar57._0_8_ = 0xff800000ff800000;
            auVar57._12_4_ = 0xff800000;
            auVar128 = ZEXT1664(auVar57);
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar57,
                               (undefined1  [16])terminated.field_0);
            iVar33 = 2;
          }
          auVar263 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar277 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar284 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          auVar104 = ZEXT1664((undefined1  [16])vVar9.field_0);
          if (uVar35 < uVar31) goto LAB_0030bc5d;
        }
      } while (iVar33 != 3);
LAB_0030d446:
      auVar20 = vandps_avx(auVar20,(undefined1  [16])terminated.field_0);
      auVar103._8_4_ = 0xff800000;
      auVar103._0_8_ = 0xff800000ff800000;
      auVar103._12_4_ = 0xff800000;
      auVar20 = vmaskmovps_avx(auVar20,auVar103);
      *(undefined1 (*) [16])pRVar1 = auVar20;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }